

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O1

void run_schnorrsig_tests(void)

{
  byte *pbVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  int iVar142;
  uint32_t uVar143;
  uint32_t uVar144;
  secp256k1_context *extraout_RAX;
  secp256k1_context *psVar145;
  secp256k1_context *extraout_RAX_00;
  secp256k1_context *extraout_RAX_01;
  secp256k1_context *extraout_RAX_02;
  secp256k1_context *extraout_RAX_03;
  secp256k1_context *extraout_RAX_04;
  secp256k1_context *extraout_RAX_05;
  secp256k1_context *extraout_RAX_06;
  secp256k1_context *extraout_RAX_07;
  secp256k1_context *extraout_RAX_08;
  secp256k1_context *extraout_RAX_09;
  secp256k1_context *extraout_RAX_10;
  secp256k1_context *extraout_RAX_11;
  secp256k1_context *extraout_RAX_12;
  secp256k1_context *extraout_RAX_13;
  ulong uVar146;
  ulong uVar147;
  ulong uVar148;
  size_t in_RCX;
  long lVar149;
  ulong uVar150;
  uint uVar151;
  secp256k1_schnorrsig_extraparams *psVar153;
  code *unaff_RBP;
  ulong uVar154;
  ulong uVar155;
  secp256k1_context *psVar156;
  ulong uVar157;
  ulong uVar158;
  size_t in_R8;
  ulong uVar159;
  ulong uVar160;
  secp256k1_schnorrsig_extraparams *pubkey;
  ulong uVar161;
  secp256k1_schnorrsig_extraparams *psVar162;
  ulong uVar163;
  code *msg_00;
  secp256k1_schnorrsig_extraparams *keypair;
  ulong uVar164;
  byte bVar165;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar *args [5];
  uchar nonce_z [32];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  secp256k1_fe sStackY_460;
  secp256k1_schnorrsig_extraparams *psStackY_438;
  secp256k1_schnorrsig_extraparams *psStackY_430;
  secp256k1_schnorrsig_extraparams *psStackY_428;
  secp256k1_schnorrsig_extraparams *psStackY_420;
  secp256k1_schnorrsig_extraparams *psStackY_418;
  secp256k1_schnorrsig_extraparams *psStackY_410;
  int local_3ec;
  _func_void_char_ptr_void_ptr *local_3e8;
  void *pvStack_3e0;
  secp256k1_schnorrsig_extraparams local_3d8;
  undefined8 uStack_3c0;
  secp256k1_schnorrsig_extraparams local_3b8;
  undefined1 local_398 [8];
  secp256k1_schnorrsig_extraparams *psStack_390;
  secp256k1_nonce_function_hardened *local_388;
  secp256k1_schnorrsig_extraparams *psStack_380;
  secp256k1_schnorrsig_extraparams *local_378;
  uchar auStack_370 [56];
  secp256k1_schnorrsig_extraparams local_338;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  secp256k1_schnorrsig_extraparams local_2f8;
  undefined8 uStack_2e0;
  secp256k1_nonce_function_hardened local_2d8 [4];
  secp256k1_schnorrsig_extraparams local_2b8;
  ulong local_290;
  undefined1 local_288 [16];
  void *local_278;
  uchar auStack_270 [72];
  undefined1 local_228 [16];
  void *local_218;
  uchar auStack_210 [8];
  secp256k1_schnorrsig_extraparams local_208;
  uchar auStack_1f0 [8];
  secp256k1_xonly_pubkey local_1e8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [16];
  void *local_158;
  uchar auStack_150 [72];
  secp256k1_schnorrsig_extraparams local_108 [4];
  secp256k1_schnorrsig_extraparams local_a8 [4];
  secp256k1_schnorrsig_extraparams local_48;
  secp256k1_schnorrsig_extraparams *psVar152;
  secp256k1_schnorrsig_extraparams *psVar166;
  
  psVar162 = &local_3b8;
  local_3b8.noncefp._0_5_ = 0x65636e6f6e;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146214;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228[0] = '5';
  local_228[1] = '[';
  local_228[2] = 'a';
  local_228[3] = 'F';
  local_228._4_4_ = 0xf4bfbff7;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_218 = (void *)0x5735866160217180;
  auStack_210[0] = 'T';
  auStack_210[1] = 0x9e;
  auStack_210[2] = 0xa2;
  auStack_210[3] = '!';
  auStack_210[4] = 'L';
  auStack_210[5] = '{';
  auStack_210[6] = 0xb0;
  auStack_210[7] = 'h';
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146248;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14625c;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonceBIP0340/challenge",0xb);
  local_228[0] = '\x19';
  local_228[1] = '2';
  local_228[2] = 0xdd;
  local_228[3] = '$';
  local_228._4_4_ = 0x4eba7e70;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_218 = (void *)0x4c44df973afbe4b1;
  auStack_210[0] = '9';
  auStack_210[1] = '\'';
  auStack_210[2] = 0xac;
  auStack_210[3] = 'J';
  auStack_210[4] = '\n';
  auStack_210[5] = 0x85;
  auStack_210[6] = 0x9e;
  auStack_210[7] = '$';
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146282;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146292;
  testrand256(local_2b8.magic);
  psVar166 = &local_2f8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1462a2;
  testrand256(psVar166->magic);
  pubkey = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1462b2;
  testrand256((uchar *)pubkey);
  psVar152 = &local_3d8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1462bf;
  testrand256(psVar152->magic);
  psVar153 = &local_2b8;
  local_398 = (undefined1  [8])&local_2b8;
  psStack_390 = psVar166;
  local_388 = (secp256k1_nonce_function_hardened *)pubkey;
  psStack_380 = psVar162;
  local_378 = psVar152;
  if (0 < COUNT) {
    psVar153 = (secp256k1_schnorrsig_extraparams *)local_398;
    psVar152 = (secp256k1_schnorrsig_extraparams *)0x0;
    do {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146300;
      nonce_function_bip340_bitflip((uchar **)psVar153,0,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146312;
      nonce_function_bip340_bitflip((uchar **)psVar153,1,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146324;
      nonce_function_bip340_bitflip((uchar **)psVar153,2,0x20,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146336;
      nonce_function_bip340_bitflip((uchar **)psVar153,3,0xd,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146348;
      nonce_function_bip340_bitflip((uchar **)psVar153,3,0xd,in_RCX,in_R8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14635a;
      nonce_function_bip340_bitflip((uchar **)psVar153,4,0x20,in_RCX,in_R8);
      uVar151 = (int)psVar152 + 1;
      psVar152 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar151;
    } while ((int)uVar151 < COUNT);
  }
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1463a4;
  iVar142 = nonce_function_bip340
                      (local_288,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,(void *)0x0);
  keypair = psVar162;
  if (iVar142 == 0) goto LAB_00148967;
  keypair = &local_3b8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1463be;
  testrand_bytes_test(keypair->magic,0xd);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1463fc;
  iVar142 = nonce_function_bip340
                      (local_288,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,keypair->magic,0xd,(void *)0x0);
  if (iVar142 == 0) goto LAB_0014896c;
  if (0 < COUNT) {
    psVar152 = (secp256k1_schnorrsig_extraparams *)0x0;
    keypair = &local_338;
    psVar166 = &local_2b8;
    pubkey = &local_2f8;
    psVar162 = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
    unaff_RBP = (code *)&local_3b8;
    do {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146442;
      uVar143 = testrand_int(0x1f);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14646d;
      iVar142 = nonce_function_bip340
                          (keypair->magic,psVar166->magic,(ulong)(uVar143 & 0x1f),pubkey->magic,
                           (uchar *)psVar162,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar142 == 0) goto LAB_001488a9;
      lVar149 = 0;
      do {
        iVar142 = (uint)(byte)local_288[lVar149] - (uint)local_338.magic[lVar149];
        if (local_288[lVar149] != local_338.magic[lVar149]) goto LAB_001464a0;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x20);
      iVar142 = 0;
LAB_001464a0:
      if (iVar142 == 0) goto LAB_001488ae;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1464b2;
      uVar143 = testrand_int(0xc);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1464f9;
      iVar142 = nonce_function_bip340
                          (keypair->magic,psVar166->magic,0x20,pubkey->magic,(uchar *)psVar162,
                           (uchar *)unaff_RBP,((ulong)uVar143 + 0xd) % 0xd,(void *)0x0);
      if (iVar142 == 0) goto LAB_001488b3;
      lVar149 = 0;
      do {
        iVar142 = (uint)(byte)local_288[lVar149] - (uint)local_338.magic[lVar149];
        if (local_288[lVar149] != local_338.magic[lVar149]) goto LAB_0014652c;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x20);
      iVar142 = 0;
LAB_0014652c:
      psVar153 = psVar152;
      if (iVar142 == 0) goto LAB_001488b8;
      uVar151 = (int)psVar152 + 1;
      psVar152 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar151;
    } while ((int)uVar151 < COUNT);
  }
  local_3d8.ndata = (secp256k1_nonce_function_hardened *)0x0;
  uStack_3c0 = 0;
  local_3d8.magic[0] = '\0';
  local_3d8.magic[1] = '\0';
  local_3d8.magic[2] = '\0';
  local_3d8.magic[3] = '\0';
  local_3d8._4_4_ = 0;
  local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146590;
  iVar142 = nonce_function_bip340
                      (local_338.magic,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,&local_3d8);
  if (iVar142 == 0) goto LAB_00148971;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1465d8;
  iVar142 = nonce_function_bip340
                      (local_288,local_2b8.magic,0x20,local_2f8.magic,
                       (uchar *)&(&local_2f8)[1].noncefp,local_3b8.magic,0xd,(void *)0x0);
  if (iVar142 == 0) goto LAB_00148976;
  lVar149 = 0;
  do {
    iVar142 = (uint)local_338.magic[lVar149] - (uint)(byte)local_288[lVar149];
    if (local_338.magic[lVar149] != local_288[lVar149]) goto LAB_0014660b;
    lVar149 = lVar149 + 1;
  } while (lVar149 != 0x20);
  iVar142 = 0;
LAB_0014660b:
  if (iVar142 != 0) goto LAB_0014897b;
  auStack_370[0x28] = '\0';
  auStack_370[0x29] = '\0';
  auStack_370[0x2a] = '\0';
  auStack_370[0x2b] = '\0';
  auStack_370[0x2c] = '\0';
  auStack_370[0x2d] = '\0';
  auStack_370[0x2e] = '\0';
  auStack_370[0x2f] = '\0';
  auStack_370[0x30] = '\0';
  auStack_370[0x31] = '\0';
  auStack_370[0x32] = '\0';
  auStack_370[0x33] = '\0';
  auStack_370[0x34] = '\0';
  auStack_370[0x35] = '\0';
  auStack_370[0x36] = '\0';
  auStack_370[0x37] = '\0';
  auStack_370[0x18] = '\0';
  auStack_370[0x19] = '\0';
  auStack_370[0x1a] = '\0';
  auStack_370[0x1b] = '\0';
  auStack_370[0x1c] = '\0';
  auStack_370[0x1d] = '\0';
  auStack_370[0x1e] = '\0';
  auStack_370[0x1f] = '\0';
  auStack_370[0x20] = '\0';
  auStack_370[0x21] = '\0';
  auStack_370[0x22] = '\0';
  auStack_370[0x23] = '\0';
  auStack_370[0x24] = '\0';
  auStack_370[0x25] = '\0';
  auStack_370[0x26] = '\0';
  auStack_370[0x27] = '\0';
  auStack_370[8] = '\0';
  auStack_370[9] = '\0';
  auStack_370[10] = '\0';
  auStack_370[0xb] = '\0';
  auStack_370[0xc] = '\0';
  auStack_370[0xd] = '\0';
  auStack_370[0xe] = '\0';
  auStack_370[0xf] = '\0';
  auStack_370[0x10] = '\0';
  auStack_370[0x11] = '\0';
  auStack_370[0x12] = '\0';
  auStack_370[0x13] = '\0';
  auStack_370[0x14] = '\0';
  auStack_370[0x15] = '\0';
  auStack_370[0x16] = '\0';
  auStack_370[0x17] = '\0';
  local_378 = (secp256k1_schnorrsig_extraparams *)0x0;
  auStack_370[0] = '\0';
  auStack_370[1] = '\0';
  auStack_370[2] = '\0';
  auStack_370[3] = '\0';
  auStack_370[4] = '\0';
  auStack_370[5] = '\0';
  auStack_370[6] = '\0';
  auStack_370[7] = '\0';
  local_388 = (secp256k1_nonce_function_hardened *)0x0;
  psStack_380 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_398 = (undefined1  [8])0x0;
  psStack_390 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_5_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48.magic[0] = '\0';
  local_48.magic[1] = '\0';
  local_48.magic[2] = '\0';
  local_48.magic[3] = '\0';
  local_48._4_4_ = 0;
  local_48.noncefp = (secp256k1_nonce_function_hardened)0x0;
  local_48.ndata = (void *)0x0;
  psVar152 = &local_2b8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14667f;
  testrand256(psVar152->magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14668c;
  testrand256(local_2f8.magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146699;
  testrand256((uchar *)&(&local_2f8)[1].noncefp);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1466a3;
  testrand256(local_3d8.magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1466ba;
  iVar142 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,psVar152->magic);
  if (iVar142 == 0) goto LAB_00148980;
  keypair = (secp256k1_schnorrsig_extraparams *)(auStack_150 + 0x48);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1466e1;
  iVar142 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,local_2f8.magic);
  if (iVar142 == 0) goto LAB_00148985;
  psVar152 = local_a8;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146708;
  iVar142 = secp256k1_keypair_create
                      (CTX,(secp256k1_keypair *)psVar152,(uchar *)&(&local_2f8)[1].noncefp);
  if (iVar142 == 0) goto LAB_0014898a;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14672e;
  iVar142 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                       (secp256k1_keypair *)local_168);
  if (iVar142 == 0) goto LAB_0014898f;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14674f;
  iVar142 = secp256k1_keypair_xonly_pub(CTX,&local_1e8,(int *)0x0,(secp256k1_keypair *)keypair);
  if (iVar142 == 0) goto LAB_00148994;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146770;
  iVar142 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,(secp256k1_keypair *)psVar152);
  if (iVar142 == 0) goto LAB_00148999;
  auStack_270[0x18] = '\0';
  auStack_270[0x19] = '\0';
  auStack_270[0x1a] = '\0';
  auStack_270[0x1b] = '\0';
  auStack_270[0x1c] = '\0';
  auStack_270[0x1d] = '\0';
  auStack_270[0x1e] = '\0';
  auStack_270[0x1f] = '\0';
  auStack_270[0x20] = '\0';
  auStack_270[0x21] = '\0';
  auStack_270[0x22] = '\0';
  auStack_270[0x23] = '\0';
  auStack_270[0x24] = '\0';
  auStack_270[0x25] = '\0';
  auStack_270[0x26] = '\0';
  auStack_270[0x27] = '\0';
  auStack_270[8] = '\0';
  auStack_270[9] = '\0';
  auStack_270[10] = '\0';
  auStack_270[0xb] = '\0';
  auStack_270[0xc] = '\0';
  auStack_270[0xd] = '\0';
  auStack_270[0xe] = '\0';
  auStack_270[0xf] = '\0';
  auStack_270[0x10] = '\0';
  auStack_270[0x11] = '\0';
  auStack_270[0x12] = '\0';
  auStack_270[0x13] = '\0';
  auStack_270[0x14] = '\0';
  auStack_270[0x15] = '\0';
  auStack_270[0x16] = '\0';
  auStack_270[0x17] = '\0';
  local_278 = (void *)0x0;
  auStack_270[0] = '\0';
  auStack_270[1] = '\0';
  auStack_270[2] = '\0';
  auStack_270[3] = '\0';
  auStack_270[4] = '\0';
  auStack_270[5] = '\0';
  auStack_270[6] = '\0';
  auStack_270[7] = '\0';
  local_288[0] = '\0';
  local_288[1] = '\0';
  local_288[2] = '\0';
  local_288[3] = '\0';
  local_288._4_4_ = 0;
  local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1467d0;
  iVar142 = secp256k1_schnorrsig_sign_internal
                      (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                       nonce_function_bip340,(void *)0x0);
  psVar145 = CTX;
  if (iVar142 == 0) goto LAB_0014899e;
  local_3ec = 0;
  local_3e8 = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (secp256k1_context_static == CTX) goto LAB_001489a3;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar145->illegal_callback).data = &local_3ec;
  do {
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146849;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_001489c1;
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_001489c6;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489c1;
      run_schnorrsig_tests_cold_2();
LAB_001489c1:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489c6;
      run_schnorrsig_tests_cold_3();
      psVar145 = extraout_RAX_00;
LAB_001489c6:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489da;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1468df;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338.magic,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_001489e4;
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_001489e9;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489e4;
      run_schnorrsig_tests_cold_4();
LAB_001489e4:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489e9;
      run_schnorrsig_tests_cold_5();
      psVar145 = extraout_RAX_01;
LAB_001489e9:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489fd;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146973;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,
                         nonce_function_bip340,(void *)0x0);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148a07;
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_00148a0c;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a07;
      run_schnorrsig_tests_cold_6();
LAB_00148a07:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a0c;
      run_schnorrsig_tests_cold_7();
      psVar145 = extraout_RAX_02;
LAB_00148a0c:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a20;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146a09;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_398,
                         nonce_function_bip340,(void *)0x0);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      psVar145 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_00148a2a;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_00148a2f;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a2a;
      run_schnorrsig_tests_cold_8();
LAB_00148a2a:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a2f;
      run_schnorrsig_tests_cold_9();
      psVar145 = extraout_RAX_03;
LAB_00148a2f:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a43;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146aa6;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (STATIC_CTX,local_338.magic,local_3d8.magic,0x20,
                         (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
    psVar145 = STATIC_CTX;
    if (iVar142 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148a4d;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146af7;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                           &local_3b8);
      psVar145 = CTX;
      if (iVar142 == 0) goto LAB_00148a52;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00148a57;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a4d;
      run_schnorrsig_tests_cold_10();
LAB_00148a4d:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a52;
      run_schnorrsig_tests_cold_11();
LAB_00148a52:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a57;
      run_schnorrsig_tests_cold_84();
      psVar145 = extraout_RAX_04;
LAB_00148a57:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a6b;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146b66;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (CTX,(uchar *)0x0,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148a75;
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_00148a7a;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a75;
      run_schnorrsig_tests_cold_12();
LAB_00148a75:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a7a;
      run_schnorrsig_tests_cold_13();
      psVar145 = extraout_RAX_05;
LAB_00148a7a:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a8e;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146bf2;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338.magic,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                         &local_3b8);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148a98;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146c36;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (psVar145,local_338.magic,(uchar *)0x0,0,(secp256k1_keypair *)local_168,
                           &local_3b8);
      psVar145 = CTX;
      if (iVar142 == 0) goto LAB_00148a9d;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00148aa2;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a98;
      run_schnorrsig_tests_cold_14();
LAB_00148a98:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148a9d;
      run_schnorrsig_tests_cold_15();
LAB_00148a9d:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148aa2;
      run_schnorrsig_tests_cold_83();
      psVar145 = extraout_RAX_06;
LAB_00148aa2:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ab6;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146ca6;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)0x0,
                         &local_3b8);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148ac0;
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_00148ac5;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ac0;
      run_schnorrsig_tests_cold_16();
LAB_00148ac0:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ac5;
      run_schnorrsig_tests_cold_17();
      psVar145 = extraout_RAX_07;
LAB_00148ac5:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ad9;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146d32;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_398,
                         &local_3b8);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148ae3;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146d82;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (psVar145,local_338.magic,local_3d8.magic,0x20,
                           (secp256k1_keypair *)local_168,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      psVar145 = CTX;
      if (iVar142 == 0) goto LAB_00148ae8;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00148aed;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ae3;
      run_schnorrsig_tests_cold_18();
LAB_00148ae3:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148ae8;
      run_schnorrsig_tests_cold_19();
LAB_00148ae8:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148aed;
      run_schnorrsig_tests_cold_82();
      psVar145 = extraout_RAX_08;
LAB_00148aed:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b01;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146dfa;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                         &local_48);
    psVar145 = CTX;
    if (iVar142 == 0) {
      (CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      psVar145 = STATIC_CTX;
      if (local_3ec != 1) goto LAB_00148b0b;
      local_3ec = 0;
      local_3e8 = (STATIC_CTX->illegal_callback).fn;
      pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
      if (secp256k1_context_static == STATIC_CTX) goto LAB_00148b10;
      (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b0b;
      run_schnorrsig_tests_cold_20();
LAB_00148b0b:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b10;
      run_schnorrsig_tests_cold_21();
      psVar145 = extraout_RAX_09;
LAB_00148b10:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b24;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146e8d;
    iVar142 = secp256k1_schnorrsig_sign_custom
                        (STATIC_CTX,local_338.magic,local_3d8.magic,0x20,
                         (secp256k1_keypair *)local_168,&local_3b8);
    psVar145 = STATIC_CTX;
    if (iVar142 == 0) {
      (STATIC_CTX->illegal_callback).fn = local_3e8;
      (psVar145->illegal_callback).data = pvStack_3e0;
      if (local_3ec != 1) goto LAB_00148b2e;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146ee8;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,local_338.magic,local_3d8.magic,0x20,(secp256k1_keypair *)local_168,
                           nonce_function_bip340,(void *)0x0);
      if (iVar142 == 0) goto LAB_00148b33;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146f16;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,local_338.magic,local_3d8.magic,0x20,
                           (secp256k1_xonly_pubkey *)local_228);
      psVar145 = CTX;
      if (iVar142 == 0) goto LAB_00148b38;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00148b3d;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b2e;
      run_schnorrsig_tests_cold_22();
LAB_00148b2e:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b33;
      run_schnorrsig_tests_cold_23();
LAB_00148b33:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b38;
      run_schnorrsig_tests_cold_81();
LAB_00148b38:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b3d;
      run_schnorrsig_tests_cold_80();
      psVar145 = extraout_RAX_10;
LAB_00148b3d:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b51;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146f7b;
    (*(CTX->illegal_callback).fn)("sig64 != NULL",(CTX->illegal_callback).data);
    psVar145 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar145->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_00148b5b;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b5b;
      run_schnorrsig_tests_cold_24();
      psVar145 = extraout_RAX_11;
LAB_00148b5b:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b6f;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x146ff2;
    (*(CTX->illegal_callback).fn)("msg != NULL || msglen == 0",(CTX->illegal_callback).data);
    psVar145 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar145->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147029;
      iVar142 = secp256k1_schnorrsig_verify
                          (psVar145,local_338.magic,(uchar *)0x0,0,
                           (secp256k1_xonly_pubkey *)local_228);
      psVar145 = CTX;
      if (iVar142 != 0) goto LAB_00148b79;
      local_3ec = 0;
      local_3e8 = (CTX->illegal_callback).fn;
      pvStack_3e0 = (CTX->illegal_callback).data;
      if (secp256k1_context_static == CTX) goto LAB_00148b7e;
      (CTX->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b79;
      run_schnorrsig_tests_cold_25();
LAB_00148b79:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b7e;
      run_schnorrsig_tests_cold_26();
      psVar145 = extraout_RAX_12;
LAB_00148b7e:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b92;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14708e;
    (*(CTX->illegal_callback).fn)("pubkey != NULL",(CTX->illegal_callback).data);
    psVar145 = CTX;
    (CTX->illegal_callback).fn = local_3e8;
    (psVar145->illegal_callback).data = pvStack_3e0;
    if (local_3ec == 1) {
      local_3ec = 0;
      local_3e8 = (psVar145->illegal_callback).fn;
      pvStack_3e0 = (psVar145->illegal_callback).data;
      if (secp256k1_context_static == psVar145) goto LAB_00148b9c;
      (psVar145->illegal_callback).fn = counting_callback_fn;
      (psVar145->illegal_callback).data = &local_3ec;
    }
    else {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148b9c;
      run_schnorrsig_tests_cold_27();
      psVar145 = extraout_RAX_13;
LAB_00148b9c:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bb0;
      (*(psVar145->illegal_callback).fn)
                ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
    }
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147110;
    psVar156 = CTX;
    iVar142 = secp256k1_schnorrsig_verify
                        (CTX,local_338.magic,local_3d8.magic,0x20,
                         (secp256k1_xonly_pubkey *)local_288);
    psVar145 = CTX;
    if (iVar142 != 0) {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bba;
      run_schnorrsig_tests_cold_28();
LAB_00148bba:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bbf;
      run_schnorrsig_tests_cold_29();
LAB_00148bbf:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bc4;
      run_schnorrsig_tests_cold_30();
LAB_00148bc4:
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bc9;
      run_schnorrsig_tests_cold_31();
      goto LAB_00148bc9;
    }
    (CTX->illegal_callback).fn = local_3e8;
    (psVar145->illegal_callback).data = pvStack_3e0;
    if (local_3ec != 1) goto LAB_00148bba;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147152;
    secp256k1_sha256_initialize_tagged
              ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
    local_228[0] = '\x11';
    local_228[1] = 0xba;
    local_228[2] = 0xec;
    local_228[3] = 0x9c;
    local_228._4_4_ = 0x23925381;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
    local_218 = (void *)0x3cc76597c87550;
    auStack_210[0] = 'd';
    auStack_210[1] = '\x11';
    auStack_210[2] = 0xf6;
    auStack_210[3] = 0x90;
    auStack_210[4] = 'j';
    auStack_210[5] = 0xb6;
    auStack_210[6] = 0xe9;
    auStack_210[7] = '3';
    local_1e8.data[0x20] = '@';
    local_1e8.data[0x21] = '\0';
    local_1e8.data[0x22] = '\0';
    local_1e8.data[0x23] = '\0';
    local_1e8.data[0x24] = '\0';
    local_1e8.data[0x25] = '\0';
    local_1e8.data[0x26] = '\0';
    local_1e8.data[0x27] = '\0';
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147182;
    test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
    local_218 = (void *)0x0;
    auStack_210[0] = '\0';
    auStack_210[1] = '\0';
    auStack_210[2] = '\0';
    auStack_210[3] = '\0';
    auStack_210[4] = '\0';
    auStack_210[5] = '\0';
    auStack_210[6] = '\0';
    auStack_210[7] = '\x03';
    local_228[0] = '\0';
    local_228[1] = '\0';
    local_228[2] = '\0';
    local_228[3] = '\0';
    local_228._4_4_ = 0;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_388 = (secp256k1_nonce_function_hardened *)0xb0996f8345c831b5;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
    local_398[0] = 0xf9;
    local_398[1] = '0';
    local_398[2] = 0x8a;
    local_398[3] = '\x01';
    local_398._4_4_ = 0x10c35892;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x29529df8854f3449;
    local_278 = (void *)0x0;
    auStack_270[0] = '\0';
    auStack_270[1] = '\0';
    auStack_270[2] = '\0';
    auStack_270[3] = '\0';
    auStack_270[4] = '\0';
    auStack_270[5] = '\0';
    auStack_270[6] = '\0';
    auStack_270[7] = '\0';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288._4_4_ = 0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_338.ndata = (void *)0x0;
    uStack_320 = 0;
    local_338.magic[0] = '\0';
    local_338.magic[1] = '\0';
    local_338.magic[2] = '\0';
    local_338.magic[3] = '\0';
    local_338._4_4_ = 0;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
    auStack_150[0x18] = 0xeb;
    auStack_150[0x19] = 0xee;
    auStack_150[0x1a] = 0xe8;
    auStack_150[0x1b] = 0xfd;
    auStack_150[0x1c] = 0xb2;
    auStack_150[0x1d] = '\x17';
    auStack_150[0x1e] = '/';
    auStack_150[0x1f] = 'G';
    auStack_150[0x20] = '}';
    auStack_150[0x21] = 0xf4;
    auStack_150[0x22] = 0x90;
    auStack_150[0x23] = '\r';
    auStack_150[0x24] = '1';
    auStack_150[0x25] = '\x05';
    auStack_150[0x26] = '6';
    auStack_150[0x27] = 0xc0;
    auStack_150[8] = '%';
    auStack_150[9] = 0xf6;
    auStack_150[10] = 'j';
    auStack_150[0xb] = 'J';
    auStack_150[0xc] = 0x85;
    auStack_150[0xd] = 0xea;
    auStack_150[0xe] = 0x8b;
    auStack_150[0xf] = 'q';
    auStack_150[0x10] = 0xe4;
    auStack_150[0x11] = 0x82;
    auStack_150[0x12] = 0xa7;
    auStack_150[0x13] = 'O';
    auStack_150[0x14] = '8';
    auStack_150[0x15] = '-';
    auStack_150[0x16] = ',';
    auStack_150[0x17] = 0xe5;
    local_158 = (void *)0x8b007835f1cdf4b;
    auStack_150[0] = 'L';
    auStack_150[1] = 'U';
    auStack_150[2] = 0xf1;
    auStack_150[3] = 0xce;
    auStack_150[4] = '-';
    auStack_150[5] = 0xca;
    auStack_150[6] = 0x82;
    auStack_150[7] = '\x15';
    local_168[0] = 0xe9;
    local_168[1] = '\a';
    local_168[2] = 0x83;
    local_168[3] = '\x1f';
    local_168._4_4_ = 0x108d8480;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147233;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14724c;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x56dab4380f16e762;
    auStack_210[0] = 0xa7;
    auStack_210[1] = 0x84;
    auStack_210[2] = 0xd9;
    auStack_210[3] = '\x04';
    auStack_210[4] = 'Q';
    auStack_210[5] = 0x90;
    auStack_210[6] = 0xcf;
    auStack_210[7] = 0xef;
    local_228[0] = 0xb7;
    local_228[1] = 0xe1;
    local_228[2] = 'Q';
    local_228[3] = 'b';
    local_228._4_4_ = 0x6a2aed8a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
    local_388 = (secp256k1_nonce_function_hardened *)0xd8cedea21daefe58;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
    local_398[0] = 0xdf;
    local_398[1] = 0xf1;
    local_398[2] = 0xd7;
    local_398[3] = '\x7f';
    local_398._4_4_ = 0x5f1c672a;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xbe4123db26371836;
    local_278 = (void *)0;
    auStack_270[0] = '\0';
    auStack_270[1] = '\0';
    auStack_270[2] = '\0';
    auStack_270[3] = '\0';
    auStack_270[4] = '\0';
    auStack_270[5] = '\0';
    auStack_270[6] = '\0';
    auStack_270[7] = '\x01';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288[4] = '\0';
    local_288[5] = '\0';
    local_288[6] = '\0';
    local_288[7] = '\0';
    local_288[8] = '\0';
    local_288[9] = '\0';
    local_288[10] = '\0';
    local_288[0xb] = '\0';
    local_288[0xc] = '\0';
    local_288[0xd] = '\0';
    local_288[0xe] = '\0';
    local_288[0xf] = '\0';
    local_338.ndata = (void *)0xd0319f29223809a4;
    uStack_320 = 0x896c4eec98fa2e08;
    local_338.magic[0] = '$';
    local_338.magic[1] = '?';
    local_338.magic[2] = 'j';
    local_338.magic[3] = 0x88;
    local_338._4_4_ = 0xd308a385;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
    auStack_150[0x18] = 0x89;
    auStack_150[0x19] = '~';
    auStack_150[0x1a] = 0xfc;
    auStack_150[0x1b] = 0xb6;
    auStack_150[0x1c] = '9';
    auStack_150[0x1d] = 0xea;
    auStack_150[0x1e] = 0x87;
    auStack_150[0x1f] = '\x1c';
    auStack_150[0x20] = 0xfa;
    auStack_150[0x21] = 0x95;
    auStack_150[0x22] = 0xf6;
    auStack_150[0x23] = 0xde;
    auStack_150[0x24] = '3';
    auStack_150[0x25] = 0x9e;
    auStack_150[0x26] = 'K';
    auStack_150[0x27] = '\n';
    auStack_150[8] = 0x89;
    auStack_150[9] = '\x06';
    auStack_150[10] = 0xd1;
    auStack_150[0xb] = '\x1a';
    auStack_150[0xc] = 0xc9;
    auStack_150[0xd] = 'v';
    auStack_150[0xe] = 0xab;
    auStack_150[0xf] = 0xcc;
    auStack_150[0x10] = 0xb2;
    auStack_150[0x11] = '\v';
    auStack_150[0x12] = '\t';
    auStack_150[0x13] = '\x12';
    auStack_150[0x14] = 0x92;
    auStack_150[0x15] = 0xbf;
    auStack_150[0x16] = 0xf4;
    auStack_150[0x17] = 0xea;
    local_158 = (void *)0x17f9436d3e41de1b;
    auStack_150[0] = 0xdc;
    auStack_150[1] = 0x8d;
    auStack_150[2] = 0xcf;
    auStack_150[3] = 0x8c;
    auStack_150[4] = 'x';
    auStack_150[5] = 0xde;
    auStack_150[6] = '3';
    auStack_150[7] = 'A';
    local_168[0] = 'h';
    local_168[1] = 0x96;
    local_168[2] = 0xbd;
    local_168[3] = '`';
    local_168._4_4_ = 0x6d29aeee;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147319;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147332;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x74cc678a084e0229;
    auStack_210[0] = '\x02';
    auStack_210[1] = '\v';
    auStack_210[2] = 0xbe;
    auStack_210[3] = 0xa6;
    auStack_210[4] = ';';
    auStack_210[5] = '\x14';
    auStack_210[6] = 0xe5;
    auStack_210[7] = 0xc9;
    local_228[0] = 0xc9;
    local_228[1] = '\x0f';
    local_228[2] = 0xda;
    local_228[3] = 0xa2;
    local_228._4_4_ = 0x34c26821;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
    local_388 = (secp256k1_nonce_function_hardened *)0xc986b00953713901;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
    local_398[0] = 0xdd;
    local_398[1] = '0';
    local_398[2] = 0x8a;
    local_398[3] = 0xfe;
    local_398._4_4_ = 0x137e77c5;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xccb7c19c2ba71f12;
    local_278 = (void *)0x2c69d1c6cd760e08;
    auStack_270[0] = 'K';
    auStack_270[1] = '\v';
    auStack_270[2] = 'b';
    auStack_270[3] = 0xd7;
    auStack_270[4] = 0x98;
    auStack_270[5] = 0xe6;
    auStack_270[6] = 0xd9;
    auStack_270[7] = '\x06';
    local_288[0] = 200;
    local_288[1] = 'z';
    local_288[2] = 0xa5;
    local_288[3] = '8';
    local_288._4_4_ = 0xaed7b424;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0xccbcbbb5a235b02e;
    local_338.ndata = (void *)0x33776cb5aa0598da;
    uStack_320 = 0x5cb708a5d0b92430;
    local_338.magic[0] = '~';
    local_338.magic[1] = '-';
    local_338.magic[2] = 'X';
    local_338.magic[3] = 0xd8;
    local_338._4_4_ = 0x1adfbcb3;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
    auStack_150[0x18] = 'z';
    auStack_150[0x19] = 0xde;
    auStack_150[0x1a] = 0xa9;
    auStack_150[0x1b] = 0x8d;
    auStack_150[0x1c] = 0x82;
    auStack_150[0x1d] = 0xf8;
    auStack_150[0x1e] = 'H';
    auStack_150[0x1f] = '\x1e';
    auStack_150[0x20] = '\x0e';
    auStack_150[0x21] = '\x1e';
    auStack_150[0x22] = '\x03';
    auStack_150[0x23] = 'g';
    auStack_150[0x24] = 'J';
    auStack_150[0x25] = 'o';
    auStack_150[0x26] = '?';
    auStack_150[0x27] = 0xb7;
    auStack_150[8] = 0xab;
    auStack_150[9] = 't';
    auStack_150[10] = 'X';
    auStack_150[0xb] = 'y';
    auStack_150[0xc] = 0xa5;
    auStack_150[0xd] = 0xad;
    auStack_150[0xe] = 0x95;
    auStack_150[0xf] = 'J';
    auStack_150[0x10] = 'r';
    auStack_150[0x11] = 0xc4;
    auStack_150[0x12] = 'Z';
    auStack_150[0x13] = 0x91;
    auStack_150[0x14] = 0xc3;
    auStack_150[0x15] = 0xa5;
    auStack_150[0x16] = '\x1d';
    auStack_150[0x17] = '<';
    local_158 = (void *)0x8b8d72602acf9bc4;
    auStack_150[0] = 'L';
    auStack_150[1] = ' ';
    auStack_150[2] = '\x0f';
    auStack_150[3] = 'P';
    auStack_150[4] = 0xdd;
    auStack_150[5] = '1';
    auStack_150[6] = '<';
    auStack_150[7] = '\x1b';
    local_168[0] = 'X';
    local_168[1] = '1';
    local_168[2] = 0xaa;
    local_168[3] = 0xee;
    local_168._4_4_ = 0xb74bb4d7;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
    psVar162 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1473fb;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar162,local_398,local_288,local_338.magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147414;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,0x20,local_168,1);
    local_218 = (void *)0x54a23fcf62307712;
    auStack_210[0] = 0x9e;
    auStack_210[1] = 'D';
    auStack_210[2] = 0xf5;
    auStack_210[3] = 0x8e;
    auStack_210[4] = 0xd2;
    auStack_210[5] = '@';
    auStack_210[6] = '\x17';
    auStack_210[7] = '\x10';
    local_228[0] = '\v';
    local_228[1] = 'C';
    local_228[2] = '+';
    local_228[3] = '&';
    local_228._4_4_ = 0x81739377;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
    local_388 = (secp256k1_nonce_function_hardened *)0x8a461df2fb950d3a;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
    local_398[0] = '%';
    local_398[1] = 0xd1;
    local_398[2] = 0xdf;
    local_398[3] = 0xf9;
    local_398._4_4_ = 0x25f50551;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0xad96a928f622403c;
    local_278 = (void *)0xffffffffffffffff;
    auStack_270[0] = 0xff;
    auStack_270[1] = 0xff;
    auStack_270[2] = 0xff;
    auStack_270[3] = 0xff;
    auStack_270[4] = 0xff;
    auStack_270[5] = 0xff;
    auStack_270[6] = 0xff;
    auStack_270[7] = 0xff;
    local_288[0] = 0xff;
    local_288[1] = 0xff;
    local_288[2] = 0xff;
    local_288[3] = 0xff;
    local_288._4_4_ = 0xffffffff;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    local_338.ndata = (void *)0xffffffffffffffff;
    uStack_320 = 0xffffffffffffffff;
    local_338.magic[0] = 0xff;
    local_338.magic[1] = 0xff;
    local_338.magic[2] = 0xff;
    local_338.magic[3] = 0xff;
    local_338._4_4_ = 0xffffffff;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    auStack_150[0x18] = 0xf2;
    auStack_150[0x19] = '_';
    auStack_150[0x1a] = 0xd7;
    auStack_150[0x1b] = 0x88;
    auStack_150[0x1c] = 0x81;
    auStack_150[0x1d] = 0xeb;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '\'';
    auStack_150[0x20] = 'q';
    auStack_150[0x21] = 0xfc;
    auStack_150[0x22] = 'Y';
    auStack_150[0x23] = '\"';
    auStack_150[0x24] = 0xef;
    auStack_150[0x25] = 0xc6;
    auStack_150[0x26] = 'n';
    auStack_150[0x27] = 0xa3;
    auStack_150[8] = 0x97;
    auStack_150[9] = 'X';
    auStack_150[10] = '+';
    auStack_150[0xb] = 0x9c;
    auStack_150[0xc] = 0xb1;
    auStack_150[0xd] = '=';
    auStack_150[0xe] = 0xb3;
    auStack_150[0xf] = 0x93;
    auStack_150[0x10] = '7';
    auStack_150[0x11] = '\x05';
    auStack_150[0x12] = 0xb3;
    auStack_150[0x13] = '+';
    auStack_150[0x14] = 0xa9;
    auStack_150[0x15] = 0x82;
    auStack_150[0x16] = 0xaf;
    auStack_150[0x17] = 'Z';
    local_158 = (void *)0xb651dd87a1c1ec65;
    auStack_150[0] = 'O';
    auStack_150[1] = 0xda;
    auStack_150[2] = '\x1e';
    auStack_150[3] = 0xdc;
    auStack_150[4] = 0x96;
    auStack_150[5] = '7';
    auStack_150[6] = 0xd5;
    auStack_150[7] = 0xec;
    local_168[0] = '~';
    local_168[1] = 0xb0;
    local_168[2] = 'P';
    local_168[3] = 0x97;
    local_168._4_4_ = 0xf146e257;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
    psVar166 = (secp256k1_schnorrsig_extraparams *)local_228;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    pubkey = &local_338;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474c8;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)psVar166,(uchar *)keypair,local_288,pubkey->magic,0x20,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1474e1;
    test_schnorrsig_bip_vectors_check_verify((uchar *)keypair,pubkey->magic,0x20,local_168,1);
    local_218 = (void *)0xaae28b6d7430fa7d;
    auStack_210[0] = 'e';
    auStack_210[1] = 0x97;
    auStack_210[2] = '_';
    auStack_210[3] = ')';
    auStack_210[4] = 0xd2;
    auStack_210[5] = '-';
    auStack_210[6] = 199;
    auStack_210[7] = 0xb9;
    local_228[0] = 0xd6;
    local_228[1] = 0x9c;
    local_228[2] = '5';
    local_228[3] = '\t';
    local_228._4_4_ = 0x12e499bb;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
    local_388 = (secp256k1_nonce_function_hardened *)0x9b591ac87578f199;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
    local_398 = (undefined1  [8])0xb283cc8ff6c3f34d;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x24a73104c9429d7e;
    auStack_150[0x18] = '`';
    auStack_150[0x19] = 0xcb;
    auStack_150[0x1a] = 'q';
    auStack_150[0x1b] = 0xc0;
    auStack_150[0x1c] = 'N';
    auStack_150[0x1d] = 0x80;
    auStack_150[0x1e] = 0xf5;
    auStack_150[0x1f] = 0x93;
    auStack_150[0x20] = '\x06';
    auStack_150[0x21] = '\v';
    auStack_150[0x22] = '\a';
    auStack_150[0x23] = 0xd2;
    auStack_150[0x24] = 0x83;
    auStack_150[0x25] = '\b';
    auStack_150[0x26] = 0xd7;
    auStack_150[0x27] = 0xf4;
    auStack_150[8] = 'v';
    auStack_150[9] = 0xaf;
    auStack_150[10] = 0xb1;
    auStack_150[0xb] = 'T';
    auStack_150[0xc] = 0x8a;
    auStack_150[0xd] = 0xf6;
    auStack_150[0xe] = '\x03';
    auStack_150[0xf] = 0xb3;
    auStack_150[0x10] = 0xeb;
    auStack_150[0x11] = 'E';
    auStack_150[0x12] = 0xc9;
    auStack_150[0x13] = 0xf8;
    auStack_150[0x14] = ' ';
    auStack_150[0x15] = '}';
    auStack_150[0x16] = 0xee;
    auStack_150[0x17] = '\x10';
    local_158 = (void *)0x28aaf51494eda089;
    auStack_150[0] = 0xad;
    auStack_150[1] = '\r';
    auStack_150[2] = 0x96;
    auStack_150[3] = 0xd6;
    auStack_150[4] = 'y';
    auStack_150[5] = '_';
    auStack_150[6] = 0x9c;
    auStack_150[7] = 'c';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
    psVar152 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147562;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar152,local_398,0x20,local_168,1);
    local_218 = (void *)0x8776b979ae9898eb;
    auStack_210[0] = 'f';
    auStack_210[1] = 0xe4;
    auStack_210[2] = 0xfa;
    auStack_210[3] = 0xa0;
    auStack_210[4] = 'J';
    auStack_210[5] = '-';
    auStack_210[6] = 'J';
    auStack_210[7] = '4';
    local_228[0] = 0xee;
    local_228[1] = 0xfd;
    local_228[2] = 0xea;
    local_228[3] = 'L';
    local_228._4_4_ = 0x507767db;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147593;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar142 != 0) goto LAB_00148bbf;
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'z';
    auStack_150[0x19] = 's';
    auStack_150[0x1a] = 0xc6;
    auStack_150[0x1b] = 'C';
    auStack_150[0x1c] = 0xe1;
    auStack_150[0x1d] = 'f';
    auStack_150[0x1e] = 0xbe;
    auStack_150[0x1f] = '^';
    auStack_150[0x20] = 0xbe;
    auStack_150[0x21] = 0xaf;
    auStack_150[0x22] = 0xa3;
    auStack_150[0x23] = 'K';
    auStack_150[0x24] = '\x1a';
    auStack_150[0x25] = 0xc5;
    auStack_150[0x26] = 'S';
    auStack_150[0x27] = 0xe2;
    auStack_150[8] = '<';
    auStack_150[9] = 0xc2;
    auStack_150[10] = 'y';
    auStack_150[0xb] = 'D';
    auStack_150[0xc] = 'd';
    auStack_150[0xd] = '\n';
    auStack_150[0xe] = 0xc6;
    auStack_150[0xf] = '\a';
    auStack_150[0x10] = 0xcd;
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'z';
    auStack_150[0x13] = 0xe1;
    auStack_150[0x14] = '\t';
    auStack_150[0x15] = '#';
    auStack_150[0x16] = 0xd9;
    auStack_150[0x17] = 0xef;
    local_158 = (void *)0x8ba168852f47f682;
    auStack_150[0] = '/';
    auStack_150[1] = '\x05';
    auStack_150[2] = 'z';
    auStack_150[3] = '\x14';
    auStack_150[4] = '`';
    auStack_150[5] = ')';
    auStack_150[6] = 'u';
    auStack_150[7] = 'V';
    local_168[0] = 0xff;
    local_168[1] = 0xf9;
    local_168[2] = '{';
    local_168[3] = 0xd5;
    local_168._4_4_ = 0xa4ee5e75;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14761f;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'b';
    auStack_150[0x19] = '*';
    auStack_150[0x1a] = 0x95;
    auStack_150[0x1b] = 'L';
    auStack_150[0x1c] = 0xfe;
    auStack_150[0x1d] = 'T';
    auStack_150[0x1e] = 'W';
    auStack_150[0x1f] = '5';
    auStack_150[0x20] = 0xaa;
    auStack_150[0x21] = 0xea;
    auStack_150[0x22] = 'Q';
    auStack_150[0x23] = '4';
    auStack_150[0x24] = 0xfc;
    auStack_150[0x25] = 0xcd;
    auStack_150[0x26] = 0xb2;
    auStack_150[0x27] = 0xbd;
    auStack_150[8] = '(';
    auStack_150[9] = 0x89;
    auStack_150[10] = '\v';
    auStack_150[0xb] = '>';
    auStack_150[0xc] = 0xdb;
    auStack_150[0xd] = 'n';
    auStack_150[0xe] = 'q';
    auStack_150[0xf] = 0x89;
    auStack_150[0x10] = 0xb6;
    auStack_150[0x11] = '0';
    auStack_150[0x12] = 'D';
    auStack_150[0x13] = 0x8b;
    auStack_150[0x14] = 'Q';
    auStack_150[0x15] = '\\';
    auStack_150[0x16] = 0xe4;
    auStack_150[0x17] = 0xf8;
    local_158 = (void *)0xf46f3fdf13b032b4;
    auStack_150[0] = 0xf9;
    auStack_150[1] = 0x9f;
    auStack_150[2] = 0xcb;
    auStack_150[3] = '3';
    auStack_150[4] = 0xe0;
    auStack_150[5] = 0xe1;
    auStack_150[6] = 'Q';
    auStack_150[7] = '_';
    local_168[0] = '\x1f';
    local_168[1] = 0xa6;
    local_168[2] = '.';
    local_168[3] = '3';
    local_168._4_4_ = 0x1cc2db1e;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1476a3;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xe8;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = 0xc9;
    auStack_150[0x1b] = '>';
    auStack_150[0x1c] = '\0';
    auStack_150[0x1d] = 0xc5;
    auStack_150[0x1e] = 0xed;
    auStack_150[0x1f] = '\f';
    auStack_150[0x20] = '\x18';
    auStack_150[0x21] = '4';
    auStack_150[0x22] = 0xff;
    auStack_150[0x23] = '\r';
    auStack_150[0x24] = '\f';
    auStack_150[0x25] = '.';
    auStack_150[0x26] = 'm';
    auStack_150[0x27] = 0xa6;
    auStack_150[8] = 0x96;
    auStack_150[9] = '\x17';
    auStack_150[10] = 'd';
    auStack_150[0xb] = 0xb3;
    auStack_150[0xc] = 0xaa;
    auStack_150[0xd] = 0x9b;
    auStack_150[0xe] = '/';
    auStack_150[0xf] = 0xfc;
    auStack_150[0x10] = 0xb6;
    auStack_150[0x11] = 0xef;
    auStack_150[0x12] = 0x94;
    auStack_150[0x13] = '{';
    auStack_150[0x14] = 'h';
    auStack_150[0x15] = 0x87;
    auStack_150[0x16] = 0xa2;
    auStack_150[0x17] = '&';
    local_158 = (void *)0x96d9b2896097c174;
    auStack_150[0] = '=';
    auStack_150[1] = 0xa2;
    auStack_150[2] = 0xe5;
    auStack_150[3] = 'T';
    auStack_150[4] = '>';
    auStack_150[5] = '\x17';
    auStack_150[6] = 'w';
    auStack_150[7] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168._4_4_ = 0xea696ca8;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147729;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 'O';
    auStack_150[0x19] = 0xb7;
    auStack_150[0x1a] = '4';
    auStack_150[0x1b] = 'v';
    auStack_150[0x1c] = 0xf0;
    auStack_150[0x1d] = 0xd5;
    auStack_150[0x1e] = 0x94;
    auStack_150[0x1f] = 0xdc;
    auStack_150[0x20] = 0xb6;
    auStack_150[0x21] = '\\';
    auStack_150[0x22] = 'd';
    auStack_150[0x23] = '%';
    auStack_150[0x24] = 0xbd;
    auStack_150[0x25] = '\x18';
    auStack_150[0x26] = '`';
    auStack_150[0x27] = 'Q';
    auStack_150[8] = '\x12';
    auStack_150[9] = '=';
    auStack_150[10] = 0xda;
    auStack_150[0xb] = 0x83;
    auStack_150[0xc] = '(';
    auStack_150[0xd] = 0xaf;
    auStack_150[0xe] = 0x9c;
    auStack_150[0xf] = '#';
    auStack_150[0x10] = 0xa9;
    auStack_150[0x11] = 'L';
    auStack_150[0x12] = '\x1f';
    auStack_150[0x13] = 0xee;
    auStack_150[0x14] = 0xcf;
    auStack_150[0x15] = 0xd1;
    auStack_150[0x16] = '#';
    auStack_150[0x17] = 0xba;
    local_158 = (void *)0x0;
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\0';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1477af;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xdb;
    auStack_150[0x19] = 0xa8;
    auStack_150[0x1a] = '\x7f';
    auStack_150[0x1b] = '\x11';
    auStack_150[0x1c] = 0xac;
    auStack_150[0x1d] = 'g';
    auStack_150[0x1e] = 'T';
    auStack_150[0x1f] = 0xf9;
    auStack_150[0x20] = '7';
    auStack_150[0x21] = 0x80;
    auStack_150[0x22] = 0xd5;
    auStack_150[0x23] = 0xa1;
    auStack_150[0x24] = 0x83;
    auStack_150[0x25] = '|';
    auStack_150[0x26] = 0xf1;
    auStack_150[0x27] = 0x97;
    auStack_150[8] = 'v';
    auStack_150[9] = '\x15';
    auStack_150[10] = 0xfb;
    auStack_150[0xb] = 0xaf;
    auStack_150[0xc] = 'Z';
    auStack_150[0xd] = 0xe2;
    auStack_150[0xe] = 0x88;
    auStack_150[0xf] = 'd';
    auStack_150[0x10] = '\x01';
    auStack_150[0x11] = '<';
    auStack_150[0x12] = '\t';
    auStack_150[0x13] = 0x97;
    auStack_150[0x14] = 'B';
    auStack_150[0x15] = 0xde;
    auStack_150[0x16] = 0xad;
    auStack_150[0x17] = 0xb4;
    local_158 = (void *)0x0;
    auStack_150[0] = '\0';
    auStack_150[1] = '\0';
    auStack_150[2] = '\0';
    auStack_150[3] = '\0';
    auStack_150[4] = '\0';
    auStack_150[5] = '\0';
    auStack_150[6] = '\0';
    auStack_150[7] = '\x01';
    local_168[0] = '\0';
    local_168[1] = '\0';
    local_168[2] = '\0';
    local_168[3] = '\0';
    local_168._4_4_ = 0;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147835;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xd1;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = '\x13';
    auStack_150[0x1b] = 0xa8;
    auStack_150[0x1c] = 0xae;
    auStack_150[0x1d] = 0x82;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '/';
    auStack_150[0x20] = 0xa7;
    auStack_150[0x21] = 0x9d;
    auStack_150[0x22] = '_';
    auStack_150[0x23] = '\x7f';
    auStack_150[0x24] = 0xc4;
    auStack_150[0x25] = '\a';
    auStack_150[0x26] = 0xd3;
    auStack_150[0x27] = 0x9b;
    auStack_150[8] = 'i';
    auStack_150[9] = 0xe8;
    auStack_150[10] = 0x9b;
    auStack_150[0xb] = 'L';
    auStack_150[0xc] = 'U';
    auStack_150[0xd] = 'd';
    auStack_150[0xe] = 0xd0;
    auStack_150[0xf] = '\x03';
    auStack_150[0x10] = 'I';
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'k';
    auStack_150[0x13] = 0x84;
    auStack_150[0x14] = 0x97;
    auStack_150[0x15] = 'x';
    auStack_150[0x16] = ']';
    auStack_150[0x17] = 0xd7;
    local_158 = (void *)0xc79b260f2ba84d56;
    auStack_150[0] = '\n';
    auStack_150[1] = 't';
    auStack_150[2] = 0xf8;
    auStack_150[3] = '\"';
    auStack_150[4] = '\x04';
    auStack_150[5] = ')';
    auStack_150[6] = 0xba;
    auStack_150[7] = '\x1d';
    local_168[0] = 'J';
    local_168[1] = ')';
    local_168[2] = 0x8d;
    local_168[3] = 0xac;
    local_168._4_4_ = 0x5a3957ae;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1478bb;
    test_schnorrsig_bip_vectors_check_verify(local_228,local_398,0x20,local_168,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398[0] = '$';
    local_398[1] = '?';
    local_398[2] = 'j';
    local_398[3] = 0x88;
    local_398._4_4_ = 0xd308a385;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xd1;
    auStack_150[0x19] = 0xd7;
    auStack_150[0x1a] = '\x13';
    auStack_150[0x1b] = 0xa8;
    auStack_150[0x1c] = 0xae;
    auStack_150[0x1d] = 0x82;
    auStack_150[0x1e] = 0xb3;
    auStack_150[0x1f] = '/';
    auStack_150[0x20] = 0xa7;
    auStack_150[0x21] = 0x9d;
    auStack_150[0x22] = '_';
    auStack_150[0x23] = '\x7f';
    auStack_150[0x24] = 0xc4;
    auStack_150[0x25] = '\a';
    auStack_150[0x26] = 0xd3;
    auStack_150[0x27] = 0x9b;
    auStack_150[8] = 'i';
    auStack_150[9] = 0xe8;
    auStack_150[10] = 0x9b;
    auStack_150[0xb] = 'L';
    auStack_150[0xc] = 'U';
    auStack_150[0xd] = 'd';
    auStack_150[0xe] = 0xd0;
    auStack_150[0xf] = '\x03';
    auStack_150[0x10] = 'I';
    auStack_150[0x11] = '\x10';
    auStack_150[0x12] = 'k';
    auStack_150[0x13] = 0x84;
    auStack_150[0x14] = 0x97;
    auStack_150[0x15] = 'x';
    auStack_150[0x16] = ']';
    auStack_150[0x17] = 0xd7;
    local_158 = (void *)0xffffffffffffffff;
    auStack_150[0] = 0xff;
    auStack_150[1] = 0xff;
    auStack_150[2] = 0xff;
    auStack_150[3] = 0xfe;
    auStack_150[4] = 0xff;
    auStack_150[5] = 0xff;
    auStack_150[6] = 0xfc;
    auStack_150[7] = '/';
    local_168[0] = 0xff;
    local_168[1] = 0xff;
    local_168[2] = 0xff;
    local_168[3] = 0xff;
    local_168._4_4_ = 0xffffffff;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    keypair = (secp256k1_schnorrsig_extraparams *)local_398;
    psVar166 = (secp256k1_schnorrsig_extraparams *)local_168;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147941;
    test_schnorrsig_bip_vectors_check_verify(local_228,(uchar *)keypair,0x20,(uchar *)psVar166,0);
    local_218 = (void *)0xd8cedea21daefe58;
    auStack_210[0] = 'C';
    auStack_210[1] = '$';
    auStack_210[2] = '\x0f';
    auStack_210[3] = '{';
    auStack_210[4] = 'P';
    auStack_210[5] = '+';
    auStack_210[6] = 0xa6;
    auStack_210[7] = 'Y';
    local_228[0] = 0xdf;
    local_228[1] = 0xf1;
    local_228[2] = 0xd7;
    local_228[3] = '\x7f';
    local_228._4_4_ = 0x5f1c672a;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
    local_388 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
    local_398 = (undefined1  [8])0xd308a385886a3f24;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
    auStack_150[0x18] = 0xba;
    auStack_150[0x19] = 0xae;
    auStack_150[0x1a] = 0xdc;
    auStack_150[0x1b] = 0xe6;
    auStack_150[0x1c] = 0xaf;
    auStack_150[0x1d] = 'H';
    auStack_150[0x1e] = 0xa0;
    auStack_150[0x1f] = ';';
    auStack_150[0x20] = 0xbf;
    auStack_150[0x21] = 0xd2;
    auStack_150[0x22] = '^';
    auStack_150[0x23] = 0x8c;
    auStack_150[0x24] = 0xd0;
    auStack_150[0x25] = '6';
    auStack_150[0x26] = 'A';
    auStack_150[0x27] = 'A';
    auStack_150[8] = 0xff;
    auStack_150[9] = 0xff;
    auStack_150[10] = 0xff;
    auStack_150[0xb] = 0xff;
    auStack_150[0xc] = 0xff;
    auStack_150[0xd] = 0xff;
    auStack_150[0xe] = 0xff;
    auStack_150[0xf] = 0xff;
    auStack_150[0x10] = 0xff;
    auStack_150[0x11] = 0xff;
    auStack_150[0x12] = 0xff;
    auStack_150[0x13] = 0xff;
    auStack_150[0x14] = 0xff;
    auStack_150[0x15] = 0xff;
    auStack_150[0x16] = 0xff;
    auStack_150[0x17] = 0xfe;
    local_158 = (void *)0x96d9b2896097c174;
    auStack_150[0] = '=';
    auStack_150[1] = 0xa2;
    auStack_150[2] = 0xe5;
    auStack_150[3] = 'T';
    auStack_150[4] = '>';
    auStack_150[5] = '\x17';
    auStack_150[6] = 'w';
    auStack_150[7] = 'i';
    local_168[0] = 'l';
    local_168[1] = 0xff;
    local_168[2] = '\\';
    local_168[3] = ';';
    local_168._4_4_ = 0xea696ca8;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
    psVar152 = (secp256k1_schnorrsig_extraparams *)local_228;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1479c1;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar152,local_398,0x20,local_168,0);
    local_218 = (void *)0xffffffffffffffff;
    auStack_210[0] = 0xff;
    auStack_210[1] = 0xff;
    auStack_210[2] = 0xff;
    auStack_210[3] = 0xfe;
    auStack_210[4] = 0xff;
    auStack_210[5] = 0xff;
    auStack_210[6] = 0xfc;
    auStack_210[7] = '0';
    local_228[0] = 0xff;
    local_228[1] = 0xff;
    local_228[2] = 0xff;
    local_228[3] = 0xff;
    local_228._4_4_ = 0xffffffff;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1479f2;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
    if (iVar142 != 0) goto LAB_00148bc4;
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228._4_4_ = 0x40034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    auStack_270[0] = '\0';
    auStack_270[1] = '\0';
    auStack_270[2] = '\0';
    auStack_270[3] = '\0';
    auStack_270[4] = '\0';
    auStack_270[5] = '\0';
    auStack_270[6] = '\0';
    auStack_270[7] = '\0';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288._4_4_ = 0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    auStack_150[0x18] = 0x9f;
    auStack_150[0x19] = '-';
    auStack_150[0x1a] = 'V';
    auStack_150[0x1b] = '\x0f';
    auStack_150[0x1c] = 0xac;
    auStack_150[0x1d] = 'e';
    auStack_150[0x1e] = '(';
    auStack_150[0x1f] = '\'';
    auStack_150[0x20] = 0xd1;
    auStack_150[0x21] = 0xaf;
    auStack_150[0x22] = '\x05';
    auStack_150[0x23] = 't';
    auStack_150[0x24] = 0xe4;
    auStack_150[0x25] = '\'';
    auStack_150[0x26] = 0xab;
    auStack_150[0x27] = 'c';
    auStack_150[8] = '`';
    auStack_150[9] = 'i';
    auStack_150[10] = 0xce;
    auStack_150[0xb] = '&';
    auStack_150[0xc] = 0xbf;
    auStack_150[0xd] = '\x03';
    auStack_150[0xe] = 'F';
    auStack_150[0xf] = 'b';
    auStack_150[0x10] = '(';
    auStack_150[0x11] = 0xf1;
    auStack_150[0x12] = 0x9a;
    auStack_150[0x13] = ':';
    auStack_150[0x14] = 'b';
    auStack_150[0x15] = 0xdb;
    auStack_150[0x16] = 0x8a;
    auStack_150[0x17] = 'd';
    local_158 = (void *)0xccfc326743adb66b;
    auStack_150[0] = '%';
    auStack_150[1] = ')';
    auStack_150[2] = '\x1a';
    auStack_150[3] = 'U';
    auStack_150[4] = 0x89;
    auStack_150[5] = 'T';
    auStack_150[6] = 'd';
    auStack_150[7] = 0xcf;
    local_168[0] = 'q';
    local_168[1] = 'S';
    local_168[2] = ']';
    local_168[3] = 0xb1;
    local_168._4_4_ = 0xfbd9ec65;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
    local_290 = 0;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147aa2;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,(uchar *)0x0,0,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147ab7;
    test_schnorrsig_bip_vectors_check_verify(local_398,(uchar *)0x0,0,local_168,1);
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228._4_4_ = 0x40034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    auStack_270[0] = '\0';
    auStack_270[1] = '\0';
    auStack_270[2] = '\0';
    auStack_270[3] = '\0';
    auStack_270[4] = '\0';
    auStack_270[5] = '\0';
    auStack_270[6] = '\0';
    auStack_270[7] = '\0';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288._4_4_ = 0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
    local_338.magic[0] = '\x11';
    auStack_150[0x18] = 0xfe;
    auStack_150[0x19] = '|';
    auStack_150[0x1a] = 0xac;
    auStack_150[0x1b] = 0xfc;
    auStack_150[0x1c] = 'Z';
    auStack_150[0x1d] = 'W';
    auStack_150[0x1e] = '}';
    auStack_150[0x1f] = '3';
    auStack_150[0x20] = 0xec;
    auStack_150[0x21] = '\x14';
    auStack_150[0x22] = 'V';
    auStack_150[0x23] = 'L';
    auStack_150[0x24] = 0xec;
    auStack_150[0x25] = '+';
    auStack_150[0x26] = 0xac;
    auStack_150[0x27] = 0xbf;
    auStack_150[8] = 0xea;
    auStack_150[9] = '1';
    auStack_150[10] = 's';
    auStack_150[0xb] = 0xbf;
    auStack_150[0xc] = 0xea;
    auStack_150[0xd] = 'f';
    auStack_150[0xe] = 0x83;
    auStack_150[0xf] = 0xbd;
    auStack_150[0x10] = '\x10';
    auStack_150[0x11] = '\x1f';
    auStack_150[0x12] = 0xa5;
    auStack_150[0x13] = 0xaa;
    auStack_150[0x14] = ']';
    auStack_150[0x15] = 0xbc;
    auStack_150[0x16] = '\x19';
    auStack_150[0x17] = 0x96;
    local_158 = (void *)0x354c3be64a93b9b1;
    auStack_150[0] = '\x11';
    auStack_150[1] = 0xf3;
    auStack_150[2] = 0xae;
    auStack_150[3] = '\x11';
    auStack_150[4] = '4';
    auStack_150[5] = 0xc6;
    auStack_150[6] = 0xa3;
    auStack_150[7] = '\x03';
    local_168[0] = '\b';
    local_168[1] = 0xa2;
    local_168[2] = '\n';
    local_168[3] = '\n';
    local_168._4_4_ = 0x2441f6fe;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147b65;
    test_schnorrsig_bip_vectors_check_signing
              (local_228,local_398,local_288,local_338.magic,1,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147b7e;
    test_schnorrsig_bip_vectors_check_verify(local_398,local_338.magic,1,local_168,1);
    local_218 = (void *)0x4003400340034003;
    builtin_memcpy(auStack_210,"\x03@\x03@\x03@\x03@",8);
    local_228[0] = '\x03';
    local_228[1] = '@';
    local_228[2] = '\x03';
    local_228[3] = '@';
    local_228._4_4_ = 0x40034003;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
    local_388 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
    local_398[0] = 'w';
    local_398[1] = 0x8c;
    local_398[2] = 0xaa;
    local_398[3] = 'S';
    local_398._4_4_ = 0xc43a39b4;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
    local_278 = (void *)0x0;
    auStack_270[0] = '\0';
    auStack_270[1] = '\0';
    auStack_270[2] = '\0';
    auStack_270[3] = '\0';
    auStack_270[4] = '\0';
    auStack_270[5] = '\0';
    auStack_270[6] = '\0';
    auStack_270[7] = '\0';
    local_288[0] = '\0';
    local_288[1] = '\0';
    local_288[2] = '\0';
    local_288[3] = '\0';
    local_288._4_4_ = 0;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x0;
    local_338.ndata = (void *)CONCAT71(local_338.ndata._1_7_,0x11);
    builtin_memcpy(local_338.magic,"\x01\x02\x03\x04",4);
    local_338._4_4_ = 0x8070605;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
    auStack_150[0x18] = 0xe1;
    auStack_150[0x19] = 0xe5;
    auStack_150[0x1a] = 0xa3;
    auStack_150[0x1b] = '\x7f';
    auStack_150[0x1c] = 0xd8;
    auStack_150[0x1d] = '\x0e';
    auStack_150[0x1e] = 'Z';
    auStack_150[0x1f] = 'Q';
    auStack_150[0x20] = 0x89;
    auStack_150[0x21] = '|';
    auStack_150[0x22] = 'U';
    auStack_150[0x23] = 'f';
    auStack_150[0x24] = 0xa9;
    auStack_150[0x25] = '~';
    auStack_150[0x26] = 0xa5;
    auStack_150[0x27] = 0xa5;
    auStack_150[8] = 0xc4;
    auStack_150[9] = 0xa4;
    auStack_150[10] = 0x82;
    auStack_150[0xb] = 0xb7;
    auStack_150[0xc] = '{';
    auStack_150[0xd] = 0xf9;
    auStack_150[0xe] = '`';
    auStack_150[0xf] = 0xf8;
    auStack_150[0x10] = 'h';
    auStack_150[0x11] = '\x15';
    auStack_150[0x12] = '@';
    auStack_150[0x13] = 0xe2;
    auStack_150[0x14] = '[';
    auStack_150[0x15] = 'g';
    auStack_150[0x16] = 'q';
    auStack_150[0x17] = 0xec;
    local_158 = (void *)0x523c1ea7d199865d;
    auStack_150[0] = 0xda;
    auStack_150[1] = 0x9a;
    auStack_150[2] = 0xfd;
    auStack_150[3] = 0xb6;
    auStack_150[4] = 0xb5;
    auStack_150[5] = '\n';
    auStack_150[6] = 0xc3;
    auStack_150[7] = 'p';
    local_168[0] = 'Q';
    local_168[1] = '0';
    local_168[2] = 0xf3;
    local_168[3] = 0x9a;
    local_168._4_4_ = 0x3bb45940;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
    keypair = (secp256k1_schnorrsig_extraparams *)local_228;
    psVar166 = (secp256k1_schnorrsig_extraparams *)local_398;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147c37;
    test_schnorrsig_bip_vectors_check_signing
              ((uchar *)keypair,(uchar *)psVar166,local_288,local_338.magic,0x11,local_168);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147c50;
    test_schnorrsig_bip_vectors_check_verify((uchar *)psVar166,local_338.magic,0x11,local_168,1);
    local_388 = (secp256k1_nonce_function_hardened *)0x4003400340034003;
    psStack_380 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_398 = (undefined1  [8])0x4003400340034003;
    psStack_390 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
    local_278 = (void *)0x238be6f6b6faf94b;
    auStack_270[0] = '\b';
    auStack_270[1] = 'd';
    auStack_270[2] = 0x97;
    auStack_270[3] = '2';
    auStack_270[4] = 'M';
    auStack_270[5] = 'o';
    auStack_270[6] = 0xd1;
    auStack_270[7] = '\x17';
    local_288[0] = 'w';
    local_288[1] = 0x8c;
    local_288[2] = 0xaa;
    local_288[3] = 'S';
    local_288._4_4_ = 0xc43a39b4;
    local_288._8_8_ = (secp256k1_nonce_function_hardened)0x22877a49094d7767;
    local_338.ndata = (void *)0x0;
    uStack_320 = 0;
    local_338.magic[0] = '\0';
    local_338.magic[1] = '\0';
    local_338.magic[2] = '\0';
    local_338.magic[3] = '\0';
    local_338._4_4_ = 0;
    local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
    local_208.ndata = (void *)0xa0b4d0e9a0cb7f89;
    auStack_1f0[0] = 'h';
    auStack_1f0[1] = 0x94;
    auStack_1f0[2] = 0xcf;
    auStack_1f0[3] = 0xd2;
    auStack_1f0[4] = 'I';
    auStack_1f0[5] = 0xf2;
    auStack_1f0[6] = '#';
    auStack_1f0[7] = 'g';
    local_208.magic[0] = 'X';
    local_208.magic[1] = '^';
    local_208.magic[2] = 0xd3;
    local_208.magic[3] = 0xe3;
    local_208._4_1_ = '\x17';
    local_208._5_1_ = '\b';
    local_208._6_1_ = '\a';
    local_208._7_1_ = 0xe7;
    local_208.noncefp = (secp256k1_nonce_function_hardened)0x237b4cc50f723bc0;
    local_218 = (void *)0x6fbea8bf5d1e3203;
    auStack_210[0] = '\t';
    auStack_210[1] = '\x16';
    auStack_210[2] = '5';
    auStack_210[3] = '\x16';
    auStack_210[4] = '>';
    auStack_210[5] = 0xca;
    auStack_210[6] = 'y';
    auStack_210[7] = 0xa8;
    local_228[0] = '@';
    local_228[1] = ';';
    local_228[2] = '\x12';
    local_228[3] = 0xb0;
    local_228._4_4_ = 0x345a55d8;
    local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
    auStack_150[0x38] = 0x99;
    auStack_150[0x39] = 0x99;
    auStack_150[0x3a] = 0x99;
    auStack_150[0x3b] = 0x99;
    auStack_150[0x3c] = 0x99;
    auStack_150[0x3d] = 0x99;
    auStack_150[0x3e] = 0x99;
    auStack_150[0x3f] = 0x99;
    auStack_150[0x40] = 0x99;
    auStack_150[0x41] = 0x99;
    auStack_150[0x42] = 0x99;
    auStack_150[0x43] = 0x99;
    auStack_150[0x44] = 0x99;
    auStack_150[0x45] = 0x99;
    auStack_150[0x46] = 0x99;
    auStack_150[0x47] = 0x99;
    auStack_150[0x28] = 0x99;
    auStack_150[0x29] = 0x99;
    auStack_150[0x2a] = 0x99;
    auStack_150[0x2b] = 0x99;
    auStack_150[0x2c] = 0x99;
    auStack_150[0x2d] = 0x99;
    auStack_150[0x2e] = 0x99;
    auStack_150[0x2f] = 0x99;
    auStack_150[0x30] = 0x99;
    auStack_150[0x31] = 0x99;
    auStack_150[0x32] = 0x99;
    auStack_150[0x33] = 0x99;
    auStack_150[0x34] = 0x99;
    auStack_150[0x35] = 0x99;
    auStack_150[0x36] = 0x99;
    auStack_150[0x37] = 0x99;
    auStack_150[0x18] = 0x99;
    auStack_150[0x19] = 0x99;
    auStack_150[0x1a] = 0x99;
    auStack_150[0x1b] = 0x99;
    auStack_150[0x1c] = 0x99;
    auStack_150[0x1d] = 0x99;
    auStack_150[0x1e] = 0x99;
    auStack_150[0x1f] = 0x99;
    auStack_150[0x20] = 0x99;
    auStack_150[0x21] = 0x99;
    auStack_150[0x22] = 0x99;
    auStack_150[0x23] = 0x99;
    auStack_150[0x24] = 0x99;
    auStack_150[0x25] = 0x99;
    auStack_150[0x26] = 0x99;
    auStack_150[0x27] = 0x99;
    auStack_150[8] = 0x99;
    auStack_150[9] = 0x99;
    auStack_150[10] = 0x99;
    auStack_150[0xb] = 0x99;
    auStack_150[0xc] = 0x99;
    auStack_150[0xd] = 0x99;
    auStack_150[0xe] = 0x99;
    auStack_150[0xf] = 0x99;
    auStack_150[0x10] = 0x99;
    auStack_150[0x11] = 0x99;
    auStack_150[0x12] = 0x99;
    auStack_150[0x13] = 0x99;
    auStack_150[0x14] = 0x99;
    auStack_150[0x15] = 0x99;
    auStack_150[0x16] = 0x99;
    auStack_150[0x17] = 0x99;
    local_158 = (void *)0x9999999999999999;
    auStack_150[0] = 0x99;
    auStack_150[1] = 0x99;
    auStack_150[2] = 0x99;
    auStack_150[3] = 0x99;
    auStack_150[4] = 0x99;
    auStack_150[5] = 0x99;
    auStack_150[6] = 0x99;
    auStack_150[7] = 0x99;
    local_168[0] = 0x99;
    local_168[1] = 0x99;
    local_168[2] = 0x99;
    local_168[3] = 0x99;
    local_168._4_4_ = 0x99999999;
    local_168._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
    local_108[0].magic[0] = 0x99;
    local_108[0].magic[1] = 0x99;
    local_108[0].magic[2] = 0x99;
    local_108[0].magic[3] = 0x99;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147d21;
    test_schnorrsig_bip_vectors_check_signing
              (local_398,local_288,local_338.magic,local_168,100,local_228);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147d3a;
    test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
    if (COUNT < 1) break;
    keypair = (secp256k1_schnorrsig_extraparams *)local_288;
    while( true ) {
      psVar162 = (secp256k1_schnorrsig_extraparams *)local_168;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      psVar153 = &local_2b8;
      unaff_RBP = nonce_function_bip340;
      local_2f8.ndata = (void *)0x6e68637320612072;
      uStack_2e0 = 0x2e2e67697372726f;
      builtin_memcpy(local_2f8.magic,"this",4);
      local_2f8._4_4_ = 0x20736920;
      local_2f8.noncefp = (secp256k1_nonce_function_hardened)0x6f662067736d2061;
      local_308 = 0;
      uStack_300 = 0;
      local_318 = 0;
      uStack_310 = 0;
      local_338.ndata = (void *)0x0;
      uStack_320 = 0;
      local_338.magic[0] = '\0';
      local_338.magic[1] = '\0';
      local_338.magic[2] = '\0';
      local_338.magic[3] = '\0';
      local_338._4_4_ = 0;
      local_338.noncefp = (secp256k1_nonce_function_hardened)0x0;
      local_3d8.ndata = (secp256k1_nonce_function_hardened *)0x0;
      local_3d8.magic[0] = 0xda;
      local_3d8.magic[1] = 'o';
      local_3d8.magic[2] = 0xb3;
      local_3d8.magic[3] = 0x8c;
      local_3d8._4_4_ = 0;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147dc1;
      testrand256(psVar153->magic);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147dce;
      testrand256((uchar *)&(&local_2f8)[1].noncefp);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147de0;
      iVar142 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar162,psVar153->magic);
      if (iVar142 == 0) break;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147dfc;
      iVar142 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                           (secp256k1_keypair *)psVar162);
      msg_00 = (code *)psVar162;
      if (iVar142 == 0) goto LAB_001488c2;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_398;
      msg_00 = (code *)&local_2f8;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147e36;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar162,
                           nonce_function_bip340,(void *)0x0);
      if (iVar142 == 0) goto LAB_001488c7;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147e58;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      psVar162 = (secp256k1_schnorrsig_extraparams *)msg_00;
      if (iVar142 == 0) goto LAB_001488cc;
      psVar162 = (secp256k1_schnorrsig_extraparams *)local_168;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147e90;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar162,
                           nonce_function_bip340,(void *)0x0);
      if (iVar142 == 0) goto LAB_001488d1;
      lVar149 = 0;
      psVar153 = &local_3d8;
      do {
        iVar142 = (uint)(byte)local_398[lVar149] - (uint)(byte)local_288[lVar149];
        if (local_398[lVar149] != local_288[lVar149]) goto LAB_00147ec5;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x40);
      iVar142 = 0;
LAB_00147ec5:
      psVar166 = (secp256k1_schnorrsig_extraparams *)msg_00;
      if (iVar142 != 0) goto LAB_001488d6;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147ef2;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar162,
                           psVar153);
      if (iVar142 == 0) goto LAB_001488db;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147f14;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      if (iVar142 == 0) goto LAB_001488e0;
      builtin_memcpy(auStack_370 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8.noncefp = nonce_function_failing;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x147f73;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,(secp256k1_keypair *)local_168
                           ,psVar153);
      psVar162 = (secp256k1_schnorrsig_extraparams *)msg_00;
      if (iVar142 != 0) goto LAB_001488e5;
      lVar149 = 0;
      psVar162 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        iVar142 = (uint)(byte)local_398[lVar149] - (uint)local_338.magic[lVar149];
        if (local_398[lVar149] != local_338.magic[lVar149]) goto LAB_00147fae;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x40);
      iVar142 = 0;
LAB_00147fae:
      if (iVar142 != 0) goto LAB_001488ea;
      builtin_memcpy(auStack_370 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8.noncefp = nonce_function_0;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14800a;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,local_398,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar162,psVar153
                          );
      if (iVar142 != 0) goto LAB_001488ef;
      lVar149 = 0;
      do {
        iVar142 = (uint)(byte)local_398[lVar149] - (uint)local_338.magic[lVar149];
        if (local_398[lVar149] != local_338.magic[lVar149]) goto LAB_0014803a;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x40);
      iVar142 = 0;
LAB_0014803a:
      psVar166 = (secp256k1_schnorrsig_extraparams *)msg_00;
      if (iVar142 != 0) goto LAB_001488f4;
      builtin_memcpy(auStack_370 + 8,
                     "\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01",0x10);
      local_378 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      builtin_memcpy(auStack_370,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
      local_388 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_380 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_398 = (undefined1  [8])0x101010101010101;
      psStack_390 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8.noncefp = nonce_function_overflowing;
      psVar166 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14809c;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar162,
                           psVar153);
      if (iVar142 == 0) goto LAB_001488f9;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1480be;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,
                           (secp256k1_xonly_pubkey *)pubkey);
      psVar152 = psVar153;
      if (iVar142 == 0) goto LAB_001488fe;
      local_3d8.noncefp = (secp256k1_nonce_function_hardened)0x0;
      local_3d8.ndata = &(&local_2f8)[1].noncefp;
      psVar152 = (secp256k1_schnorrsig_extraparams *)local_168;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148101;
      iVar142 = secp256k1_schnorrsig_sign_custom
                          (CTX,(uchar *)psVar166,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar152,
                           psVar153);
      if (iVar142 == 0) goto LAB_00148903;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148132;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)keypair,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar152,
                           nonce_function_bip340,local_3d8.ndata);
      psVar166 = keypair;
      if (iVar142 == 0) goto LAB_00148908;
      lVar149 = 0;
      psVar152 = &local_338;
      do {
        iVar142 = (uint)(byte)local_398[lVar149] - (uint)(byte)local_288[lVar149];
        if (local_398[lVar149] != local_288[lVar149]) goto LAB_0014816a;
        lVar149 = lVar149 + 1;
      } while (lVar149 != 0x40);
      iVar142 = 0;
LAB_0014816a:
      msg_00 = (code *)&local_2b8;
      if (iVar142 != 0) goto LAB_0014890d;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148182;
      testrand256((uchar *)msg_00);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148194;
      iVar142 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair,(uchar *)msg_00);
      if (iVar142 == 0) goto LAB_00148912;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1481b0;
      iVar142 = secp256k1_keypair_xonly_pub
                          (CTX,(secp256k1_xonly_pubkey *)psVar152,(int *)0x0,
                           (secp256k1_keypair *)keypair);
      if (iVar142 == 0) goto LAB_00148917;
      psVar162 = (secp256k1_schnorrsig_extraparams *)0x0;
      psVar166 = pubkey;
      do {
        pubkey = (secp256k1_schnorrsig_extraparams *)(local_398 + (long)psVar162);
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1481ce;
        testrand256((uchar *)pubkey);
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1481f3;
        iVar142 = secp256k1_schnorrsig_sign_internal
                            (CTX,psVar166->magic,(uchar *)pubkey,0x20,(secp256k1_keypair *)keypair,
                             nonce_function_bip340,(void *)0x0);
        if (iVar142 == 0) {
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488a4;
          run_schnorrsig_tests_cold_66();
LAB_001488a4:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488a9;
          run_schnorrsig_tests_cold_65();
LAB_001488a9:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488ae;
          run_schnorrsig_tests_cold_97();
LAB_001488ae:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488b3;
          run_schnorrsig_tests_cold_96();
LAB_001488b3:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488b8;
          run_schnorrsig_tests_cold_95();
          psVar153 = psVar152;
LAB_001488b8:
          psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488bd;
          run_schnorrsig_tests_cold_94();
          goto LAB_001488bd;
        }
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148215;
        iVar142 = secp256k1_schnorrsig_verify
                            (CTX,psVar166->magic,(uchar *)pubkey,0x20,
                             (secp256k1_xonly_pubkey *)psVar152);
        if (iVar142 == 0) goto LAB_001488a4;
        psVar162 = (secp256k1_schnorrsig_extraparams *)&psVar162[1].noncefp;
        psVar166 = (secp256k1_schnorrsig_extraparams *)&psVar166[2].ndata;
      } while (psVar162 != (secp256k1_schnorrsig_extraparams *)0x60);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148235;
      uVar143 = testrand_int(3);
      uVar163 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar157 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar150 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar157;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar150;
      secp256k1_test_state[2] = uVar157 ^ uVar154;
      secp256k1_test_state[3] = uVar150 << 0x2d | uVar150 >> 0x13;
      msg_00 = (code *)(uVar163 >> 0x3b);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1482a2;
      uVar144 = testrand_int(0xfe);
      pubkey = (secp256k1_schnorrsig_extraparams *)(local_228 + (ulong)uVar143 * 0x40);
      bVar165 = (char)uVar144 + 1;
      psVar166 = (secp256k1_schnorrsig_extraparams *)(ulong)CONCAT31((int3)(uVar144 >> 8),bVar165);
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar165;
      unaff_RBP = (code *)(local_398 + (ulong)uVar143 * 0x20);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1482e4;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 != 0) goto LAB_0014891c;
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar165;
      uVar163 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar157 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar150 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar157;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar150;
      secp256k1_test_state[2] = uVar157 ^ uVar154;
      secp256k1_test_state[3] = uVar150 << 0x2d | uVar150 >> 0x13;
      msg_00 = (code *)(uVar163 >> 0x3b);
      pbVar1 = (byte *)((long)&((secp256k1_schnorrsig_extraparams *)((long)msg_00 + 0x18))->noncefp
                       + (long)pubkey);
      *pbVar1 = *pbVar1 ^ bVar165;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148373;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 != 0) goto LAB_00148921;
      (((secp256k1_schnorrsig_extraparams *)msg_00)->magic + (long)pubkey->magic)[0x20] =
           (((secp256k1_schnorrsig_extraparams *)msg_00)->magic + (long)pubkey->magic)[0x20] ^
           bVar165;
      uVar163 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0]
      ;
      uVar154 = secp256k1_test_state[1] << 0x11;
      uVar157 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar150 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar157;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar150;
      secp256k1_test_state[2] = uVar157 ^ uVar154;
      secp256k1_test_state[3] = uVar150 << 0x2d | uVar150 >> 0x13;
      msg_00 = (code *)(uVar163 >> 0x3b);
      ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
      [(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
           [(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar165;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148406;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 != 0) goto LAB_00148926;
      msg_00 = (code *)(((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic +
                       (long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic);
      ((secp256k1_schnorrsig_extraparams *)msg_00)->magic[0] =
           ((secp256k1_schnorrsig_extraparams *)msg_00)->magic[0] ^ bVar165;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14842f;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 == 0) goto LAB_0014892b;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      unaff_RBP = (code *)local_398;
      msg_00 = nonce_function_bip340;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148470;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar142 == 0) goto LAB_00148930;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148492;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 == 0) goto LAB_00148935;
      psVar166 = (secp256k1_schnorrsig_extraparams *)(auStack_210 + 8);
      local_208.ndata = (void *)0xffffffffffffffff;
      auStack_1f0[0] = 0xff;
      auStack_1f0[1] = 0xff;
      auStack_1f0[2] = 0xff;
      auStack_1f0[3] = 0xff;
      auStack_1f0[4] = 0xff;
      auStack_1f0[5] = 0xff;
      auStack_1f0[6] = 0xff;
      auStack_1f0[7] = 0xff;
      local_208.magic[0] = 0xff;
      local_208.magic[1] = 0xff;
      local_208.magic[2] = 0xff;
      local_208.magic[3] = 0xff;
      local_208._4_1_ = 0xff;
      local_208._5_1_ = 0xff;
      local_208._6_1_ = 0xff;
      local_208._7_1_ = 0xff;
      local_208.noncefp = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1484cb;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 != 0) goto LAB_0014893a;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1484f8;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,(secp256k1_keypair *)keypair,
                           nonce_function_bip340,(void *)0x0);
      if (iVar142 == 0) goto LAB_0014893f;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14851a;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 == 0) goto LAB_00148944;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148537;
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_2f8,(uchar *)psVar166,(int *)0x0);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148542;
      secp256k1_scalar_negate((secp256k1_scalar *)&local_2f8,(secp256k1_scalar *)&local_2f8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14854d;
      secp256k1_scalar_get_b32((uchar *)psVar166,(secp256k1_scalar *)&local_2f8);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148567;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                           (secp256k1_xonly_pubkey *)psVar152);
      msg_00 = (code *)&local_2f8;
      psVar153 = keypair;
      if (iVar142 != 0) goto LAB_00148949;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148593;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair,
                           (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
      if (iVar142 == 0) goto LAB_0014894e;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1485b1;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar152);
      if (iVar142 == 0) goto LAB_00148953;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1485c3;
      uVar143 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar143;
      uVar150 = 0xffffffffffffffe0;
      psVar152 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1485e1;
        testrand256(auStack_150 + uVar150 + 8);
        uVar150 = uVar150 + 0x20;
      } while (uVar150 < 0xe0);
      psVar162 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar143;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148614;
      iVar142 = secp256k1_schnorrsig_sign_internal
                          (CTX,(uchar *)pubkey,(uchar *)psVar152,(size_t)psVar162,
                           (secp256k1_keypair *)keypair,(secp256k1_nonce_function_hardened)0x0,
                           (void *)0x0);
      psVar166 = psVar162;
      if (iVar142 == 0) goto LAB_00148958;
      psVar166 = &local_338;
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14863c;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar152,(size_t)psVar162,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar142 == 0) goto LAB_0014895d;
      unaff_RBP = (code *)(ulong)(uVar143 - 1);
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14865f;
      iVar142 = secp256k1_schnorrsig_verify
                          (CTX,(uchar *)pubkey,(uchar *)psVar152,(ulong)unaff_RBP & 0xff,
                           (secp256k1_xonly_pubkey *)psVar166);
      if (iVar142 != 0) goto LAB_00148962;
      uVar151 = (int)local_290 + 1;
      local_290 = (ulong)uVar151;
      unaff_RBP = nonce_function_bip340;
      if (COUNT <= (int)uVar151) goto LAB_0014869c;
    }
LAB_001488bd:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488c2;
    run_schnorrsig_tests_cold_79();
    msg_00 = (code *)psVar162;
LAB_001488c2:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488c7;
    run_schnorrsig_tests_cold_78();
LAB_001488c7:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488cc;
    run_schnorrsig_tests_cold_77();
    psVar162 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_001488cc:
    msg_00 = (code *)psVar166;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488d1;
    run_schnorrsig_tests_cold_76();
LAB_001488d1:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488d6;
    run_schnorrsig_tests_cold_75();
    psVar166 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_001488d6:
    msg_00 = (code *)psVar162;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488db;
    run_schnorrsig_tests_cold_32();
LAB_001488db:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488e0;
    run_schnorrsig_tests_cold_74();
LAB_001488e0:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488e5;
    run_schnorrsig_tests_cold_73();
    psVar162 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_001488e5:
    msg_00 = (code *)psVar166;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488ea;
    run_schnorrsig_tests_cold_33();
LAB_001488ea:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488ef;
    run_schnorrsig_tests_cold_34();
LAB_001488ef:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488f4;
    run_schnorrsig_tests_cold_35();
    psVar166 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_001488f4:
    msg_00 = (code *)psVar162;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488f9;
    run_schnorrsig_tests_cold_36();
LAB_001488f9:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1488fe;
    run_schnorrsig_tests_cold_72();
    psVar152 = psVar153;
LAB_001488fe:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148903;
    run_schnorrsig_tests_cold_71();
LAB_00148903:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148908;
    run_schnorrsig_tests_cold_70();
LAB_00148908:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14890d;
    run_schnorrsig_tests_cold_69();
LAB_0014890d:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148912;
    run_schnorrsig_tests_cold_37();
LAB_00148912:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148917;
    run_schnorrsig_tests_cold_68();
LAB_00148917:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14891c;
    run_schnorrsig_tests_cold_67();
LAB_0014891c:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148921;
    run_schnorrsig_tests_cold_38();
LAB_00148921:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148926;
    run_schnorrsig_tests_cold_39();
LAB_00148926:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14892b;
    run_schnorrsig_tests_cold_40();
LAB_0014892b:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148930;
    run_schnorrsig_tests_cold_64();
LAB_00148930:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148935;
    run_schnorrsig_tests_cold_63();
LAB_00148935:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14893a;
    run_schnorrsig_tests_cold_62();
LAB_0014893a:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14893f;
    run_schnorrsig_tests_cold_41();
LAB_0014893f:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148944;
    run_schnorrsig_tests_cold_61();
LAB_00148944:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148949;
    run_schnorrsig_tests_cold_60();
    psVar153 = keypair;
LAB_00148949:
    keypair = (secp256k1_schnorrsig_extraparams *)msg_00;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14894e;
    run_schnorrsig_tests_cold_42();
LAB_0014894e:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148953;
    run_schnorrsig_tests_cold_59();
LAB_00148953:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148958;
    run_schnorrsig_tests_cold_58();
LAB_00148958:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14895d;
    run_schnorrsig_tests_cold_57();
LAB_0014895d:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148962;
    run_schnorrsig_tests_cold_56();
LAB_00148962:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148967;
    run_schnorrsig_tests_cold_43();
LAB_00148967:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14896c;
    run_schnorrsig_tests_cold_99();
    psVar162 = keypair;
    keypair = psVar153;
LAB_0014896c:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148971;
    run_schnorrsig_tests_cold_98();
LAB_00148971:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148976;
    run_schnorrsig_tests_cold_93();
LAB_00148976:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14897b;
    run_schnorrsig_tests_cold_92();
LAB_0014897b:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148980;
    run_schnorrsig_tests_cold_1();
LAB_00148980:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148985;
    run_schnorrsig_tests_cold_91();
LAB_00148985:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14898a;
    run_schnorrsig_tests_cold_90();
LAB_0014898a:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14898f;
    run_schnorrsig_tests_cold_89();
LAB_0014898f:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148994;
    run_schnorrsig_tests_cold_88();
LAB_00148994:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148999;
    run_schnorrsig_tests_cold_87();
LAB_00148999:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14899e;
    run_schnorrsig_tests_cold_86();
LAB_0014899e:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489a3;
    run_schnorrsig_tests_cold_85();
    psVar145 = extraout_RAX;
LAB_001489a3:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1489b7;
    (*(psVar145->illegal_callback).fn)
              ("ctx != secp256k1_context_static",(psVar145->illegal_callback).data);
  } while( true );
LAB_0014869c:
  psVar162 = (secp256k1_schnorrsig_extraparams *)local_168;
  pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
  psVar152 = &local_338;
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1486ac;
  testrand256(psVar152->magic);
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1486c3;
  psVar156 = CTX;
  iVar142 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,psVar152->magic);
  if (iVar142 == 0) {
LAB_00148bc9:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bce;
    run_schnorrsig_tests_cold_55();
LAB_00148bce:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bd3;
    run_schnorrsig_tests_cold_54();
LAB_00148bd3:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bd8;
    run_schnorrsig_tests_cold_53();
LAB_00148bd8:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bdd;
    run_schnorrsig_tests_cold_44();
LAB_00148bdd:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148be2;
    run_schnorrsig_tests_cold_52();
LAB_00148be2:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148be7;
    run_schnorrsig_tests_cold_51();
LAB_00148be7:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bec;
    run_schnorrsig_tests_cold_50();
LAB_00148bec:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bf1;
    run_schnorrsig_tests_cold_49();
LAB_00148bf1:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bf6;
    run_schnorrsig_tests_cold_48();
LAB_00148bf6:
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148bfb;
    run_schnorrsig_tests_cold_47();
  }
  else {
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1486e9;
    psVar156 = CTX;
    iVar142 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                         (secp256k1_keypair *)local_168);
    if (iVar142 == 0) goto LAB_00148bce;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14870d;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_serialize
                        (CTX,(uchar *)&(&local_2f8)[1].noncefp,(secp256k1_xonly_pubkey *)local_228);
    if (iVar142 == 0) goto LAB_00148bd3;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148731;
    psVar156 = CTX;
    iVar142 = secp256k1_keypair_xonly_tweak_add
                        (CTX,(secp256k1_keypair *)local_168,(uchar *)&(&local_2f8)[1].noncefp);
    if (iVar142 != 1) goto LAB_00148bd8;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148758;
    psVar156 = CTX;
    iVar142 = secp256k1_keypair_xonly_pub
                        (CTX,(secp256k1_xonly_pubkey *)local_398,(int *)&local_3b8,
                         (secp256k1_keypair *)local_168);
    if (iVar142 == 0) goto LAB_00148bdd;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148779;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_serialize
                        (CTX,local_2f8.magic,(secp256k1_xonly_pubkey *)local_398);
    if (iVar142 == 0) goto LAB_00148be2;
    psVar152 = &local_3d8;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14878e;
    testrand256(psVar152->magic);
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1487c1;
    psVar156 = CTX;
    iVar142 = secp256k1_schnorrsig_sign_internal
                        (CTX,local_288,psVar152->magic,0x20,(secp256k1_keypair *)local_168,
                         nonce_function_bip340,(void *)0x0);
    if (iVar142 == 0) goto LAB_00148be7;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x1487e2;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_398,local_2f8.magic);
    if (iVar142 == 0) goto LAB_00148bec;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x14880d;
    psVar156 = CTX;
    iVar142 = secp256k1_schnorrsig_verify
                        (CTX,local_288,local_3d8.magic,0x20,(secp256k1_xonly_pubkey *)local_398);
    if (iVar142 == 0) goto LAB_00148bf1;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148831;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_serialize
                        (CTX,local_2b8.magic,(secp256k1_xonly_pubkey *)local_228);
    if (iVar142 == 0) goto LAB_00148bf6;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148855;
    psVar156 = CTX;
    iVar142 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8.magic);
    if (iVar142 != 0) {
      psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148885;
      psVar156 = CTX;
      iVar142 = secp256k1_xonly_pubkey_tweak_add_check
                          (CTX,local_2f8.magic,(int)local_3b8.magic,
                           (secp256k1_xonly_pubkey *)local_228,(uchar *)&(&local_2f8)[1].noncefp);
      if (iVar142 != 0) {
        return;
      }
      goto LAB_00148c00;
    }
  }
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)0x148c00;
  run_schnorrsig_tests_cold_46();
LAB_00148c00:
  psStackY_410 = (secp256k1_schnorrsig_extraparams *)secp256k1_ge_is_valid_var;
  run_schnorrsig_tests_cold_45();
  if ((int)(psVar156->ecmult_gen_ctx).ge_offset.y.n[0] == 0) {
    uVar150 = (psVar156->ecmult_gen_ctx).ge_offset.x.n[0];
    uVar154 = (psVar156->ecmult_gen_ctx).ge_offset.x.n[1];
    uVar157 = (psVar156->ecmult_gen_ctx).ge_offset.x.n[3];
    uVar3 = uVar150 * 2;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar157;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = uVar3;
    uVar163 = (psVar156->ecmult_gen_ctx).ge_offset.x.n[2];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar163;
    auVar78._8_8_ = 0;
    auVar78._0_8_ = uVar154 * 2;
    uVar2 = (psVar156->ecmult_gen_ctx).ge_offset.x.n[4];
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar2;
    auVar79._8_8_ = 0;
    auVar79._0_8_ = uVar2;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = SUB168(auVar6 * auVar79,0);
    auVar4 = auVar4 * auVar77 + auVar5 * auVar78 + auVar7 * ZEXT816(0x1000003d10);
    uVar2 = uVar2 * 2;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uVar2;
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar150;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar157;
    auVar81._8_8_ = 0;
    auVar81._0_8_ = uVar154 * 2;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar163;
    auVar82._8_8_ = 0;
    auVar82._0_8_ = uVar163;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SUB168(auVar6 * auVar79,8);
    auVar5 = auVar11 * ZEXT816(0x1000003d10000) +
             auVar8 * auVar80 + auVar10 * auVar82 + auVar9 * auVar81 + (auVar4 >> 0x34);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uVar150;
    auVar83._8_8_ = 0;
    auVar83._0_8_ = uVar150;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uVar2;
    auVar84._8_8_ = 0;
    auVar84._0_8_ = uVar154;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = uVar157;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = uVar163 * 2;
    auVar6 = auVar14 * auVar85 + auVar13 * auVar84 + (auVar5 >> 0x34);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar5._6_2_ & 0xf);
    auVar7 = auVar12 * auVar83 + auVar15 * ZEXT816(0x1000003d1);
    uVar146 = auVar7._0_8_;
    uVar150 = auVar7._8_8_;
    auVar141._8_8_ = uVar150 >> 0x34;
    auVar141._0_8_ = uVar150 * 0x1000 | uVar146 >> 0x34;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = uVar154;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = uVar3;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = uVar2;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = uVar163;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = uVar157;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = uVar157;
    auVar6 = auVar18 * auVar88 + auVar17 * auVar87 + (auVar6 >> 0x34);
    auVar19._8_8_ = 0;
    auVar19._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar141 = auVar16 * auVar86 + auVar19 * ZEXT816(0x1000003d10) + auVar141;
    uVar147 = auVar141._0_8_;
    uVar150 = auVar141._8_8_;
    auVar132._8_8_ = uVar150 >> 0x34;
    auVar132._0_8_ = uVar150 * 0x1000 | uVar147 >> 0x34;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar163;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = uVar3;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar154;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = uVar154;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = uVar2;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = uVar157;
    auVar6 = auVar22 * auVar91 + (auVar6 >> 0x34);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar6._0_8_;
    auVar132 = auVar23 * ZEXT816(0x1000003d10) + auVar21 * auVar90 + auVar20 * auVar89 + auVar132;
    auVar7 = auVar132 >> 0x34;
    auVar136._8_8_ = 0;
    auVar136._0_8_ = auVar7._0_8_;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = auVar6._8_8_;
    auVar135._8_8_ = auVar7._8_8_;
    auVar135._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
    auVar136 = auVar24 * ZEXT816(0x1000003d10000) + auVar135 + auVar136;
    uVar155 = auVar136._0_8_;
    uVar154 = *(ulong *)&psVar156->ecmult_gen_ctx;
    uVar157 = (psVar156->ecmult_gen_ctx).scalar_offset.d[2];
    uVar150 = uVar154 * 2;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar157;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar150;
    uVar163 = (psVar156->ecmult_gen_ctx).scalar_offset.d[0];
    uVar2 = (psVar156->ecmult_gen_ctx).scalar_offset.d[1];
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar2;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = uVar163 * 2;
    uVar3 = (psVar156->ecmult_gen_ctx).scalar_offset.d[3];
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar3;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = uVar3;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = SUB168(auVar27 * auVar94,0);
    auVar4 = auVar28 * ZEXT816(0x1000003d10) + auVar26 * auVar93 + auVar25 * auVar92;
    uVar148 = uVar3 * 2;
    auVar29._8_8_ = 0;
    auVar29._0_8_ = uVar148;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = uVar154;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = uVar157;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar163 * 2;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = uVar2;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = uVar2;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = SUB168(auVar27 * auVar94,8);
    auVar8 = auVar32 * ZEXT816(0x1000003d10000) +
             auVar29 * auVar95 + auVar31 * auVar97 + auVar30 * auVar96 + (auVar4 >> 0x34);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = uVar154;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = uVar154;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = uVar148;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = uVar163;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = uVar157;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = uVar2 * 2;
    auVar6 = auVar35 * auVar100 + auVar34 * auVar99 + (auVar8 >> 0x34);
    auVar36._8_8_ = 0;
    auVar36._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar8._6_2_ & 0xf);
    auVar7 = auVar36 * ZEXT816(0x1000003d1) + auVar33 * auVar98;
    auVar37._8_8_ = 0;
    auVar37._0_8_ = uVar163;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar150;
    auVar38._8_8_ = 0;
    auVar38._0_8_ = uVar148;
    auVar102._8_8_ = 0;
    auVar102._0_8_ = uVar2;
    auVar39._8_8_ = 0;
    auVar39._0_8_ = uVar157;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = uVar157;
    auVar6 = auVar39 * auVar103 + auVar38 * auVar102 + (auVar6 >> 0x34);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar9 = (auVar7 >> 0x34) + auVar37 * auVar101 + auVar40 * ZEXT816(0x1000003d10);
    uVar158 = auVar9._0_8_;
    uVar159 = auVar9._8_8_;
    auVar41._8_8_ = 0;
    auVar41._0_8_ = uVar2;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = uVar150;
    auVar133._8_8_ = uVar159 >> 0x34;
    auVar133._0_8_ = uVar159 * 0x1000 | uVar158 >> 0x34;
    auVar42._8_8_ = 0;
    auVar42._0_8_ = uVar163;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar163;
    auVar43._8_8_ = 0;
    auVar43._0_8_ = uVar148;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = uVar157;
    auVar6 = auVar43 * auVar106 + (auVar6 >> 0x34);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = auVar6._0_8_;
    auVar133 = auVar41 * auVar104 + auVar42 * auVar105 + auVar44 * ZEXT816(0x1000003d10) + auVar133;
    auVar9 = auVar133 >> 0x34;
    auVar137._8_8_ = auVar9._8_8_;
    auVar137._0_8_ = auVar4._0_8_ & 0xffffffffffffe;
    auVar138._8_8_ = 0;
    auVar138._0_8_ = auVar9._0_8_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = auVar6._8_8_;
    auVar138 = auVar45 * ZEXT816(0x1000003d10000) + auVar137 + auVar138;
    uVar159 = auVar138._0_8_;
    uVar150 = auVar7._0_8_ & 0xfffffffffffff;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = uVar150;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = uVar157;
    uVar160 = (auVar138._8_8_ << 0xc | uVar159 >> 0x34) + (auVar8._0_8_ & 0xffffffffffff);
    uVar158 = uVar158 & 0xfffffffffffff;
    auVar47._8_8_ = 0;
    auVar47._0_8_ = uVar158;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = uVar2;
    uVar164 = auVar133._0_8_ & 0xfffffffffffff;
    auVar48._8_8_ = 0;
    auVar48._0_8_ = uVar164;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = uVar163;
    uVar159 = uVar159 & 0xfffffffffffff;
    auVar49._8_8_ = 0;
    auVar49._0_8_ = uVar159;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = uVar154;
    auVar50._8_8_ = 0;
    auVar50._0_8_ = uVar160;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = uVar3;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = SUB168(auVar50 * auVar111,0);
    auVar8 = auVar47 * auVar108 + auVar46 * auVar107 + auVar48 * auVar109 + auVar49 * auVar110 +
             auVar51 * ZEXT816(0x1000003d10);
    auVar52._8_8_ = 0;
    auVar52._0_8_ = uVar150;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = uVar3;
    auVar53._8_8_ = 0;
    auVar53._0_8_ = uVar158;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = uVar157;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = uVar164;
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar2;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = uVar159;
    auVar115._8_8_ = 0;
    auVar115._0_8_ = uVar163;
    auVar56._8_8_ = 0;
    auVar56._0_8_ = uVar160;
    auVar116._8_8_ = 0;
    auVar116._0_8_ = uVar154;
    auVar57._8_8_ = 0;
    auVar57._0_8_ = SUB168(auVar50 * auVar111,8);
    auVar4 = auVar57 * ZEXT816(0x1000003d10000) +
             auVar56 * auVar116 +
             auVar55 * auVar115 + auVar54 * auVar114 + auVar53 * auVar113 + auVar52 * auVar112 +
             (auVar8 >> 0x34);
    auVar58._8_8_ = 0;
    auVar58._0_8_ = uVar150;
    auVar117._8_8_ = 0;
    auVar117._0_8_ = uVar154;
    auVar59._8_8_ = 0;
    auVar59._0_8_ = uVar158;
    auVar118._8_8_ = 0;
    auVar118._0_8_ = uVar3;
    auVar60._8_8_ = 0;
    auVar60._0_8_ = uVar164;
    auVar119._8_8_ = 0;
    auVar119._0_8_ = uVar157;
    auVar61._8_8_ = 0;
    auVar61._0_8_ = uVar159;
    auVar120._8_8_ = 0;
    auVar120._0_8_ = uVar2;
    auVar62._8_8_ = 0;
    auVar62._0_8_ = uVar160;
    auVar121._8_8_ = 0;
    auVar121._0_8_ = uVar163;
    auVar6 = auVar62 * auVar121 + auVar61 * auVar120 + auVar60 * auVar119 + auVar59 * auVar118 +
             (auVar4 >> 0x34);
    auVar63._8_8_ = 0;
    auVar63._0_8_ = (auVar6._0_8_ & 0xfffffffffffff) << 4 | (ulong)(auVar4._6_2_ & 0xf);
    auVar7 = auVar63 * ZEXT816(0x1000003d1) + auVar58 * auVar117;
    uVar148 = auVar7._0_8_;
    uVar161 = auVar7._8_8_;
    auVar134._8_8_ = uVar161 >> 0x34;
    auVar134._0_8_ = uVar161 * 0x1000 | uVar148 >> 0x34;
    auVar64._8_8_ = 0;
    auVar64._0_8_ = uVar150;
    auVar122._8_8_ = 0;
    auVar122._0_8_ = uVar163;
    auVar65._8_8_ = 0;
    auVar65._0_8_ = uVar158;
    auVar123._8_8_ = 0;
    auVar123._0_8_ = uVar154;
    auVar66._8_8_ = 0;
    auVar66._0_8_ = uVar164;
    auVar124._8_8_ = 0;
    auVar124._0_8_ = uVar3;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = uVar159;
    auVar125._8_8_ = 0;
    auVar125._0_8_ = uVar157;
    auVar68._8_8_ = 0;
    auVar68._0_8_ = uVar160;
    auVar126._8_8_ = 0;
    auVar126._0_8_ = uVar2;
    auVar6 = auVar68 * auVar126 + auVar67 * auVar125 + auVar66 * auVar124 + (auVar6 >> 0x34);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = auVar6._0_8_ & 0xfffffffffffff;
    auVar134 = auVar69 * ZEXT816(0x1000003d10) + auVar65 * auVar123 + auVar64 * auVar122 + auVar134;
    auVar70._8_8_ = 0;
    auVar70._0_8_ = uVar150;
    auVar127._8_8_ = 0;
    auVar127._0_8_ = uVar2;
    auVar71._8_8_ = 0;
    auVar71._0_8_ = uVar158;
    auVar128._8_8_ = 0;
    auVar128._0_8_ = uVar163;
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar164;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = uVar154;
    auVar73._8_8_ = 0;
    auVar73._0_8_ = uVar159;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = uVar3;
    auVar74._8_8_ = 0;
    auVar74._0_8_ = uVar160;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = uVar157;
    auVar6 = auVar74 * auVar131 + auVar73 * auVar130 + (auVar6 >> 0x34);
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar6._0_8_;
    auVar7 = auVar75 * ZEXT816(0x1000003d10) +
             auVar72 * auVar129 + auVar71 * auVar128 + auVar70 * auVar127 + (auVar134 >> 0x34);
    auVar9 = auVar7 >> 0x34;
    auVar140._8_8_ = 0;
    auVar140._0_8_ = auVar9._0_8_;
    auVar76._8_8_ = 0;
    auVar76._0_8_ = auVar6._8_8_;
    auVar139._8_8_ = auVar9._8_8_;
    auVar139._0_8_ = auVar8._0_8_ & 0xfffffffffffff;
    auVar140 = auVar76 * ZEXT816(0x1000003d10000) + auVar139 + auVar140;
    uVar150 = auVar140._0_8_;
    sStackY_460.n[1] =
         (0x3ffffffffffffc - (uVar147 & 0xfffffffffffff)) + (auVar134._0_8_ & 0xfffffffffffff);
    sStackY_460.n[2] =
         (0x3ffffffffffffc - (auVar132._0_8_ & 0xfffffffffffff)) + (auVar7._0_8_ & 0xfffffffffffff);
    sStackY_460.n[3] =
         (0x3ffffffffffffc - (uVar155 & 0xfffffffffffff)) + (uVar150 & 0xfffffffffffff);
    sStackY_460.n[0] =
         ((uVar148 & 0xfffffffffffff) - (uVar146 & 0xfffffffffffff)) + 0x3ffffbfffff0c3;
    sStackY_460.n[4] =
         ((auVar4._0_8_ & 0xffffffffffff) -
         ((auVar136._8_8_ << 0xc | uVar155 >> 0x34) + (auVar5._0_8_ & 0xffffffffffff))) +
         0x3fffffffffffc + (auVar140._8_8_ << 0xc | uVar150 >> 0x34);
    psStackY_438 = psVar152;
    psStackY_430 = pubkey;
    psStackY_428 = psVar162;
    psStackY_420 = keypair;
    psStackY_418 = psVar166;
    psStackY_410 = (secp256k1_schnorrsig_extraparams *)unaff_RBP;
    secp256k1_fe_impl_normalizes_to_zero(&sStackY_460);
    return;
  }
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}